

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersector1<4>::
     occluded_t<embree::avx512::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Primitive PVar10;
  int iVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  byte bVar59;
  uint uVar60;
  ulong uVar61;
  Geometry *geometry;
  long lVar62;
  ulong uVar63;
  long lVar64;
  bool bVar65;
  ulong uVar66;
  byte bVar67;
  float fVar116;
  float fVar118;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar117;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined4 uVar122;
  vint4 bi_2;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  vint4 bi_1;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar132;
  undefined8 uVar133;
  float fVar140;
  vint4 bi;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar139;
  float fVar141;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  vint4 ai_2;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  vint4 ai;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar158;
  float fVar164;
  float fVar165;
  vint4 ai_1;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [64];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  undefined1 auVar184 [16];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  RTCFilterFunctionNArguments args;
  int local_524;
  Ray *local_520;
  Primitive *local_518;
  ulong local_510;
  Precalculations *local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  RTCFilterFunctionNArguments local_4f0;
  undefined1 local_4c0 [16];
  undefined8 local_4b0;
  undefined4 local_4a8;
  float local_4a4;
  undefined4 local_4a0;
  undefined4 local_49c;
  undefined4 local_498;
  uint local_494;
  uint local_490;
  Geometry *local_478;
  RayQueryContext *local_470;
  ulong local_468;
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  float local_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  int local_1dc;
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  float local_180 [4];
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar10 = prim[1];
  uVar63 = (ulong)(byte)PVar10;
  fVar158 = *(float *)(prim + uVar63 * 0x19 + 0x12);
  local_508 = pre;
  auVar72 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar63 * 0x19 + 6));
  auVar142._0_4_ = fVar158 * auVar72._0_4_;
  auVar142._4_4_ = fVar158 * auVar72._4_4_;
  auVar142._8_4_ = fVar158 * auVar72._8_4_;
  auVar142._12_4_ = fVar158 * auVar72._12_4_;
  auVar123._0_4_ = fVar158 * (ray->dir).field_0.m128[0];
  auVar123._4_4_ = fVar158 * (ray->dir).field_0.m128[1];
  auVar123._8_4_ = fVar158 * (ray->dir).field_0.m128[2];
  auVar123._12_4_ = fVar158 * (ray->dir).field_0.m128[3];
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 4 + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 5 + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 6 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xb + 6)));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar184 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar10 * 0xc) + 6)));
  auVar184 = vcvtdq2ps_avx(auVar184);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar10 * 0xc + uVar63 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  uVar66 = (ulong)(uint)((int)(uVar63 * 9) * 2);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 + uVar63 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  uVar61 = (ulong)(uint)((int)(uVar63 * 5) << 2);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar177._4_4_ = auVar123._0_4_;
  auVar177._0_4_ = auVar123._0_4_;
  auVar177._8_4_ = auVar123._0_4_;
  auVar177._12_4_ = auVar123._0_4_;
  auVar75 = vshufps_avx(auVar123,auVar123,0x55);
  auVar71 = vshufps_avx(auVar123,auVar123,0xaa);
  fVar158 = auVar71._0_4_;
  auVar134._0_4_ = fVar158 * auVar73._0_4_;
  fVar132 = auVar71._4_4_;
  auVar134._4_4_ = fVar132 * auVar73._4_4_;
  fVar139 = auVar71._8_4_;
  auVar134._8_4_ = fVar139 * auVar73._8_4_;
  fVar140 = auVar71._12_4_;
  auVar134._12_4_ = fVar140 * auVar73._12_4_;
  auVar127._0_4_ = auVar21._0_4_ * fVar158;
  auVar127._4_4_ = auVar21._4_4_ * fVar132;
  auVar127._8_4_ = auVar21._8_4_ * fVar139;
  auVar127._12_4_ = auVar21._12_4_ * fVar140;
  auVar124._0_4_ = auVar74._0_4_ * fVar158;
  auVar124._4_4_ = auVar74._4_4_ * fVar132;
  auVar124._8_4_ = auVar74._8_4_ * fVar139;
  auVar124._12_4_ = auVar74._12_4_ * fVar140;
  auVar71 = vfmadd231ps_fma(auVar134,auVar75,auVar70);
  auVar69 = vfmadd231ps_fma(auVar127,auVar75,auVar184);
  auVar75 = vfmadd231ps_fma(auVar124,auVar23,auVar75);
  auVar68 = vfmadd231ps_fma(auVar71,auVar177,auVar72);
  auVar69 = vfmadd231ps_fma(auVar69,auVar177,auVar20);
  auVar123 = vfmadd231ps_fma(auVar75,auVar22,auVar177);
  auVar178._4_4_ = auVar142._0_4_;
  auVar178._0_4_ = auVar142._0_4_;
  auVar178._8_4_ = auVar142._0_4_;
  auVar178._12_4_ = auVar142._0_4_;
  auVar75 = vshufps_avx(auVar142,auVar142,0x55);
  auVar71 = vshufps_avx(auVar142,auVar142,0xaa);
  fVar158 = auVar71._0_4_;
  auVar180._0_4_ = fVar158 * auVar73._0_4_;
  fVar132 = auVar71._4_4_;
  auVar180._4_4_ = fVar132 * auVar73._4_4_;
  fVar139 = auVar71._8_4_;
  auVar180._8_4_ = fVar139 * auVar73._8_4_;
  fVar140 = auVar71._12_4_;
  auVar180._12_4_ = fVar140 * auVar73._12_4_;
  auVar149._0_4_ = auVar21._0_4_ * fVar158;
  auVar149._4_4_ = auVar21._4_4_ * fVar132;
  auVar149._8_4_ = auVar21._8_4_ * fVar139;
  auVar149._12_4_ = auVar21._12_4_ * fVar140;
  auVar143._0_4_ = auVar74._0_4_ * fVar158;
  auVar143._4_4_ = auVar74._4_4_ * fVar132;
  auVar143._8_4_ = auVar74._8_4_ * fVar139;
  auVar143._12_4_ = auVar74._12_4_ * fVar140;
  auVar70 = vfmadd231ps_fma(auVar180,auVar75,auVar70);
  auVar73 = vfmadd231ps_fma(auVar149,auVar75,auVar184);
  auVar184 = vfmadd231ps_fma(auVar143,auVar75,auVar23);
  auVar21 = vfmadd231ps_fma(auVar70,auVar178,auVar72);
  auVar23 = vfmadd231ps_fma(auVar73,auVar178,auVar20);
  auVar170._8_4_ = 0x7fffffff;
  auVar170._0_8_ = 0x7fffffff7fffffff;
  auVar170._12_4_ = 0x7fffffff;
  auVar74 = vfmadd231ps_fma(auVar184,auVar178,auVar22);
  auVar72 = vandps_avx(auVar68,auVar170);
  auVar159._8_4_ = 0x219392ef;
  auVar159._0_8_ = 0x219392ef219392ef;
  auVar159._12_4_ = 0x219392ef;
  uVar66 = vcmpps_avx512vl(auVar72,auVar159,1);
  bVar65 = (bool)((byte)uVar66 & 1);
  auVar71._0_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar68._0_4_;
  bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar68._4_4_;
  bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar68._8_4_;
  bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar68._12_4_;
  auVar72 = vandps_avx(auVar69,auVar170);
  uVar66 = vcmpps_avx512vl(auVar72,auVar159,1);
  bVar65 = (bool)((byte)uVar66 & 1);
  auVar68._0_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar69._0_4_;
  bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar68._4_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar69._4_4_;
  bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar68._8_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar69._8_4_;
  bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar68._12_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar69._12_4_;
  auVar72 = vandps_avx(auVar123,auVar170);
  uVar66 = vcmpps_avx512vl(auVar72,auVar159,1);
  bVar65 = (bool)((byte)uVar66 & 1);
  auVar69._0_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar123._0_4_;
  bVar65 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar69._4_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar123._4_4_;
  bVar65 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar69._8_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar123._8_4_;
  bVar65 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar69._12_4_ = (uint)bVar65 * 0x219392ef | (uint)!bVar65 * auVar123._12_4_;
  auVar70 = vrcp14ps_avx512vl(auVar71);
  auVar160._8_4_ = 0x3f800000;
  auVar160._0_8_ = 0x3f8000003f800000;
  auVar160._12_4_ = 0x3f800000;
  auVar72 = vfnmadd213ps_fma(auVar71,auVar70,auVar160);
  auVar20 = vfmadd132ps_fma(auVar72,auVar70,auVar70);
  auVar70 = vrcp14ps_avx512vl(auVar68);
  auVar72 = vfnmadd213ps_fma(auVar68,auVar70,auVar160);
  auVar184 = vfmadd132ps_fma(auVar72,auVar70,auVar70);
  auVar70 = vrcp14ps_avx512vl(auVar69);
  auVar72 = vfnmadd213ps_fma(auVar69,auVar70,auVar160);
  auVar22 = vfmadd132ps_fma(auVar72,auVar70,auVar70);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar63 * 7 + 6);
  auVar72 = vpmovsxwd_avx(auVar72);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,auVar21);
  auVar155._0_4_ = auVar20._0_4_ * auVar72._0_4_;
  auVar155._4_4_ = auVar20._4_4_ * auVar72._4_4_;
  auVar155._8_4_ = auVar20._8_4_ * auVar72._8_4_;
  auVar155._12_4_ = auVar20._12_4_ * auVar72._12_4_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar63 * 9 + 6);
  auVar72 = vpmovsxwd_avx(auVar70);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,auVar21);
  auVar71 = vpbroadcastd_avx512vl();
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  auVar70 = vpmovsxwd_avx(auVar73);
  auVar135._0_4_ = auVar20._0_4_ * auVar72._0_4_;
  auVar135._4_4_ = auVar20._4_4_ * auVar72._4_4_;
  auVar135._8_4_ = auVar20._8_4_ * auVar72._8_4_;
  auVar135._12_4_ = auVar20._12_4_ * auVar72._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar63 * -2 + 6);
  auVar72 = vpmovsxwd_avx(auVar20);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,auVar23);
  auVar161._0_4_ = auVar184._0_4_ * auVar72._0_4_;
  auVar161._4_4_ = auVar184._4_4_ * auVar72._4_4_;
  auVar161._8_4_ = auVar184._8_4_ * auVar72._8_4_;
  auVar161._12_4_ = auVar184._12_4_ * auVar72._12_4_;
  auVar72 = vcvtdq2ps_avx(auVar70);
  auVar72 = vsubps_avx(auVar72,auVar23);
  auVar128._0_4_ = auVar184._0_4_ * auVar72._0_4_;
  auVar128._4_4_ = auVar184._4_4_ * auVar72._4_4_;
  auVar128._8_4_ = auVar184._8_4_ * auVar72._8_4_;
  auVar128._12_4_ = auVar184._12_4_ * auVar72._12_4_;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = *(ulong *)(prim + uVar61 + uVar63 + 6);
  auVar72 = vpmovsxwd_avx(auVar184);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,auVar74);
  auVar150._0_4_ = auVar22._0_4_ * auVar72._0_4_;
  auVar150._4_4_ = auVar22._4_4_ * auVar72._4_4_;
  auVar150._8_4_ = auVar22._8_4_ * auVar72._8_4_;
  auVar150._12_4_ = auVar22._12_4_ * auVar72._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar63 * 0x17 + 6);
  auVar72 = vpmovsxwd_avx(auVar21);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,auVar74);
  auVar125._0_4_ = auVar22._0_4_ * auVar72._0_4_;
  auVar125._4_4_ = auVar22._4_4_ * auVar72._4_4_;
  auVar125._8_4_ = auVar22._8_4_ * auVar72._8_4_;
  auVar125._12_4_ = auVar22._12_4_ * auVar72._12_4_;
  auVar72 = vpminsd_avx(auVar155,auVar135);
  auVar70 = vpminsd_avx(auVar161,auVar128);
  auVar72 = vmaxps_avx(auVar72,auVar70);
  auVar70 = vpminsd_avx(auVar150,auVar125);
  uVar122 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar22._4_4_ = uVar122;
  auVar22._0_4_ = uVar122;
  auVar22._8_4_ = uVar122;
  auVar22._12_4_ = uVar122;
  auVar70 = vmaxps_avx512vl(auVar70,auVar22);
  auVar72 = vmaxps_avx(auVar72,auVar70);
  auVar23._8_4_ = 0x3f7ffffa;
  auVar23._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar23._12_4_ = 0x3f7ffffa;
  local_250 = vmulps_avx512vl(auVar72,auVar23);
  auVar72 = vpmaxsd_avx(auVar155,auVar135);
  auVar70 = vpmaxsd_avx(auVar161,auVar128);
  auVar72 = vminps_avx(auVar72,auVar70);
  auVar70 = vpmaxsd_avx(auVar150,auVar125);
  fVar158 = ray->tfar;
  auVar74._4_4_ = fVar158;
  auVar74._0_4_ = fVar158;
  auVar74._8_4_ = fVar158;
  auVar74._12_4_ = fVar158;
  auVar70 = vminps_avx512vl(auVar70,auVar74);
  auVar72 = vminps_avx(auVar72,auVar70);
  auVar75._8_4_ = 0x3f800003;
  auVar75._0_8_ = 0x3f8000033f800003;
  auVar75._12_4_ = 0x3f800003;
  auVar72 = vmulps_avx512vl(auVar72,auVar75);
  uVar133 = vcmpps_avx512vl(local_250,auVar72,2);
  uVar66 = vpcmpgtd_avx512vl(auVar71,_DAT_01f7fcf0);
  uVar66 = ((byte)uVar133 & 0xf) & uVar66;
  local_518 = prim;
  local_520 = ray;
  if ((char)uVar66 == '\0') {
    bVar65 = false;
  }
  else {
    do {
      lVar25 = 0;
      for (uVar61 = uVar66; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      local_510 = (ulong)*(uint *)(local_518 + 2);
      pGVar12 = (context->scene->geometries).items[*(uint *)(local_518 + 2)].ptr;
      local_468 = (ulong)*(uint *)(local_518 + lVar25 * 4 + 6);
      uVar61 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                               pGVar12[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i *
                               (ulong)*(uint *)(local_518 + lVar25 * 4 + 6));
      p_Var13 = pGVar12[1].intersectionFilterN;
      lVar25 = *(long *)&pGVar12[1].time_range.upper;
      local_450 = *(undefined1 (*) [16])(lVar25 + (long)p_Var13 * uVar61);
      local_460 = *(undefined1 (*) [16])(lVar25 + (uVar61 + 1) * (long)p_Var13);
      pauVar3 = (undefined1 (*) [16])(lVar25 + (uVar61 + 2) * (long)p_Var13);
      auVar72 = *pauVar3;
      local_500 = *(undefined8 *)*pauVar3;
      uStack_4f8 = *(undefined8 *)(*pauVar3 + 8);
      uVar66 = uVar66 - 1 & uVar66;
      pauVar4 = (undefined1 (*) [12])(lVar25 + (uVar61 + 3) * (long)p_Var13);
      local_430 = (float)*(undefined8 *)*pauVar4;
      fStack_42c = (float)((ulong)*(undefined8 *)*pauVar4 >> 0x20);
      fStack_428 = (float)*(undefined8 *)(*pauVar4 + 8);
      fStack_424 = (float)((ulong)*(undefined8 *)(*pauVar4 + 8) >> 0x20);
      if (uVar66 != 0) {
        uVar63 = uVar66 - 1 & uVar66;
        for (uVar61 = uVar66; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
        }
        if (uVar63 != 0) {
          for (; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar11 = (int)pGVar12[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar5 = (local_520->org).field_0;
      auVar73 = vsubps_avx512vl(local_450,(undefined1  [16])aVar5);
      uVar122 = auVar73._0_4_;
      auVar129._4_4_ = uVar122;
      auVar129._0_4_ = uVar122;
      auVar129._8_4_ = uVar122;
      auVar129._12_4_ = uVar122;
      auVar70 = vshufps_avx(auVar73,auVar73,0x55);
      auVar73 = vshufps_avx(auVar73,auVar73,0xaa);
      aVar6 = (local_508->ray_space).vx.field_0;
      aVar7 = (local_508->ray_space).vy.field_0;
      fVar158 = (local_508->ray_space).vz.field_0.m128[0];
      fVar132 = (local_508->ray_space).vz.field_0.m128[1];
      fVar139 = (local_508->ray_space).vz.field_0.m128[2];
      fVar140 = (local_508->ray_space).vz.field_0.m128[3];
      auVar172._0_4_ = auVar73._0_4_ * fVar158;
      auVar172._4_4_ = auVar73._4_4_ * fVar132;
      auVar172._8_4_ = auVar73._8_4_ * fVar139;
      auVar172._12_4_ = auVar73._12_4_ * fVar140;
      auVar70 = vfmadd231ps_fma(auVar172,(undefined1  [16])aVar7,auVar70);
      auVar184 = vfmadd231ps_fma(auVar70,(undefined1  [16])aVar6,auVar129);
      auVar74 = vshufps_avx512vl(local_450,local_450,0xff);
      auVar73 = vsubps_avx(local_460,(undefined1  [16])aVar5);
      uVar122 = auVar73._0_4_;
      auVar136._4_4_ = uVar122;
      auVar136._0_4_ = uVar122;
      auVar136._8_4_ = uVar122;
      auVar136._12_4_ = uVar122;
      auVar70 = vshufps_avx(auVar73,auVar73,0x55);
      auVar73 = vshufps_avx(auVar73,auVar73,0xaa);
      auVar173._0_4_ = auVar73._0_4_ * fVar158;
      auVar173._4_4_ = auVar73._4_4_ * fVar132;
      auVar173._8_4_ = auVar73._8_4_ * fVar139;
      auVar173._12_4_ = auVar73._12_4_ * fVar140;
      auVar70 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar7,auVar70);
      auVar21 = vfmadd231ps_fma(auVar70,(undefined1  [16])aVar6,auVar136);
      auVar70 = vshufps_avx(local_460,local_460,0xff);
      auVar20 = vsubps_avx(auVar72,(undefined1  [16])aVar5);
      uVar122 = auVar20._0_4_;
      auVar162._4_4_ = uVar122;
      auVar162._0_4_ = uVar122;
      auVar162._8_4_ = uVar122;
      auVar162._12_4_ = uVar122;
      auVar73 = vshufps_avx(auVar20,auVar20,0x55);
      auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
      auVar175._0_4_ = auVar20._0_4_ * fVar158;
      auVar175._4_4_ = auVar20._4_4_ * fVar132;
      auVar175._8_4_ = auVar20._8_4_ * fVar139;
      auVar175._12_4_ = auVar20._12_4_ * fVar140;
      auVar73 = vfmadd231ps_fma(auVar175,(undefined1  [16])aVar7,auVar73);
      auVar20 = vfmadd231ps_fma(auVar73,(undefined1  [16])aVar6,auVar162);
      auVar75 = vshufps_avx512vl(auVar72,auVar72,0xff);
      auVar58._12_4_ = fStack_424;
      auVar58._0_12_ = *pauVar4;
      local_2c0 = ZEXT1632((undefined1  [16])aVar5);
      auVar73 = vsubps_avx(auVar58,(undefined1  [16])aVar5);
      uVar122 = auVar73._0_4_;
      auVar163._4_4_ = uVar122;
      auVar163._0_4_ = uVar122;
      auVar163._8_4_ = uVar122;
      auVar163._12_4_ = uVar122;
      auVar72 = vshufps_avx(auVar73,auVar73,0x55);
      auVar73 = vshufps_avx(auVar73,auVar73,0xaa);
      auVar176._0_4_ = auVar73._0_4_ * fVar158;
      auVar176._4_4_ = auVar73._4_4_ * fVar132;
      auVar176._8_4_ = auVar73._8_4_ * fVar139;
      auVar176._12_4_ = auVar73._12_4_ * fVar140;
      auVar72 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar7,auVar72);
      auVar73 = vfmadd231ps_fma(auVar72,(undefined1  [16])aVar6,auVar163);
      lVar25 = (long)iVar11 * 0x44;
      auVar90 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25);
      uVar122 = auVar184._0_4_;
      local_3c0._4_4_ = uVar122;
      local_3c0._0_4_ = uVar122;
      local_3c0._8_4_ = uVar122;
      local_3c0._12_4_ = uVar122;
      local_3c0._16_4_ = uVar122;
      local_3c0._20_4_ = uVar122;
      local_3c0._24_4_ = uVar122;
      local_3c0._28_4_ = uVar122;
      auVar76._8_4_ = 1;
      auVar76._0_8_ = 0x100000001;
      auVar76._12_4_ = 1;
      auVar76._16_4_ = 1;
      auVar76._20_4_ = 1;
      auVar76._24_4_ = 1;
      auVar76._28_4_ = 1;
      local_340 = vpermps_avx2(auVar76,ZEXT1632(auVar184));
      auVar91 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x484);
      local_3e0 = vbroadcastss_avx512vl(auVar21);
      local_360 = vpermps_avx512vl(auVar76,ZEXT1632(auVar21));
      auVar89 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x908);
      local_400 = vbroadcastss_avx512vl(auVar20);
      local_380 = vpermps_avx512vl(auVar76,ZEXT1632(auVar20));
      auVar88 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0xd8c);
      fVar158 = auVar73._0_4_;
      local_3a0._4_4_ = fVar158;
      local_3a0._0_4_ = fVar158;
      local_3a0._8_4_ = fVar158;
      local_3a0._12_4_ = fVar158;
      local_3a0._16_4_ = fVar158;
      local_3a0._20_4_ = fVar158;
      local_3a0._24_4_ = fVar158;
      local_3a0._28_4_ = fVar158;
      local_420 = vpermps_avx512vl(auVar76,ZEXT1632(auVar73));
      auVar76 = vmulps_avx512vl(local_3a0,auVar88);
      auVar77 = vmulps_avx512vl(local_420,auVar88);
      auVar76 = vfmadd231ps_avx512vl(auVar76,auVar89,local_400);
      auVar77 = vfmadd231ps_avx512vl(auVar77,auVar89,local_380);
      auVar76 = vfmadd231ps_avx512vl(auVar76,auVar91,local_3e0);
      auVar77 = vfmadd231ps_avx512vl(auVar77,auVar91,local_360);
      auVar78 = vfmadd231ps_avx512vl(auVar76,auVar90,local_3c0);
      auVar79 = vfmadd231ps_avx512vl(auVar77,auVar90,local_340);
      auVar76 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25);
      auVar77 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x484);
      auVar87 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x908);
      auVar86 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0xd8c);
      auVar190 = ZEXT3264(local_3a0);
      auVar80 = vmulps_avx512vl(local_3a0,auVar86);
      auVar81 = vmulps_avx512vl(local_420,auVar86);
      auVar80 = vfmadd231ps_avx512vl(auVar80,auVar87,local_400);
      auVar81 = vfmadd231ps_avx512vl(auVar81,auVar87,local_380);
      auVar80 = vfmadd231ps_avx512vl(auVar80,auVar77,local_3e0);
      auVar81 = vfmadd231ps_avx512vl(auVar81,auVar77,local_360);
      auVar22 = vfmadd231ps_fma(auVar80,auVar76,local_3c0);
      auVar23 = vfmadd231ps_fma(auVar81,auVar76,local_340);
      auVar80 = vsubps_avx512vl(ZEXT1632(auVar22),auVar78);
      auVar81 = vsubps_avx512vl(ZEXT1632(auVar23),auVar79);
      auVar82 = vmulps_avx512vl(auVar79,auVar80);
      auVar83 = vmulps_avx512vl(auVar78,auVar81);
      auVar82 = vsubps_avx512vl(auVar82,auVar83);
      auVar72 = vshufps_avx512vl(auVar58,auVar58,0xff);
      local_80 = vbroadcastsd_avx512vl(auVar74);
      uVar133 = auVar70._0_8_;
      local_a0._8_8_ = uVar133;
      local_a0._0_8_ = uVar133;
      local_a0._16_8_ = uVar133;
      local_a0._24_8_ = uVar133;
      local_c0 = vbroadcastsd_avx512vl(auVar75);
      _local_e0 = vbroadcastsd_avx512vl(auVar72);
      auVar83 = vmulps_avx512vl(_local_e0,auVar88);
      auVar83 = vfmadd231ps_avx512vl(auVar83,auVar89,local_c0);
      auVar83 = vfmadd231ps_avx512vl(auVar83,auVar91,local_a0);
      auVar83 = vfmadd231ps_avx512vl(auVar83,auVar90,local_80);
      auVar84 = vmulps_avx512vl(_local_e0,auVar86);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar87,local_c0);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar77,local_a0);
      auVar74 = vfmadd231ps_fma(auVar84,auVar76,local_80);
      auVar84 = vmulps_avx512vl(auVar81,auVar81);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar80,auVar80);
      auVar85 = vmaxps_avx512vl(auVar83,ZEXT1632(auVar74));
      auVar85 = vmulps_avx512vl(auVar85,auVar85);
      auVar84 = vmulps_avx512vl(auVar85,auVar84);
      auVar82 = vmulps_avx512vl(auVar82,auVar82);
      uVar133 = vcmpps_avx512vl(auVar82,auVar84,2);
      auVar72 = vblendps_avx(auVar184,local_450,8);
      auVar75 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar70 = vandps_avx512vl(auVar72,auVar75);
      auVar72 = vblendps_avx(auVar21,local_460,8);
      auVar72 = vandps_avx512vl(auVar72,auVar75);
      auVar70 = vmaxps_avx(auVar70,auVar72);
      auVar72 = vblendps_avx(auVar20,*pauVar3,8);
      auVar71 = vandps_avx512vl(auVar72,auVar75);
      auVar72 = vblendps_avx(auVar73,auVar58,8);
      auVar72 = vandps_avx512vl(auVar72,auVar75);
      auVar72 = vmaxps_avx(auVar71,auVar72);
      auVar72 = vmaxps_avx(auVar70,auVar72);
      auVar70 = vmovshdup_avx(auVar72);
      auVar70 = vmaxss_avx(auVar70,auVar72);
      auVar72 = vshufpd_avx(auVar72,auVar72,1);
      auVar72 = vmaxss_avx(auVar72,auVar70);
      _local_2e0 = vcvtsi2ss_avx512f(local_450,iVar11);
      auVar84._0_4_ = local_2e0._0_4_;
      auVar84._4_4_ = auVar84._0_4_;
      auVar84._8_4_ = auVar84._0_4_;
      auVar84._12_4_ = auVar84._0_4_;
      auVar84._16_4_ = auVar84._0_4_;
      auVar84._20_4_ = auVar84._0_4_;
      auVar84._24_4_ = auVar84._0_4_;
      auVar84._28_4_ = auVar84._0_4_;
      uVar24 = vcmpps_avx512vl(auVar84,_DAT_01faff40,0xe);
      bVar67 = (byte)uVar133 & (byte)uVar24;
      auVar72 = vmulss_avx512f(auVar72,ZEXT416(0x35000000));
      auVar82._8_4_ = 2;
      auVar82._0_8_ = 0x200000002;
      auVar82._12_4_ = 2;
      auVar82._16_4_ = 2;
      auVar82._20_4_ = 2;
      auVar82._24_4_ = 2;
      auVar82._28_4_ = 2;
      local_300 = vpermps_avx2(auVar82,ZEXT1632(auVar184));
      local_320 = vpermps_avx2(auVar82,ZEXT1632(auVar21));
      local_100 = vpermps_avx512vl(auVar82,ZEXT1632(auVar20));
      local_120 = vpermps_avx512vl(auVar82,ZEXT1632(auVar73));
      if (bVar67 == 0) {
        bVar65 = false;
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar183 = ZEXT3264(auVar90);
        auVar70 = vxorps_avx512vl(auVar86._0_16_,auVar86._0_16_);
        auVar185 = ZEXT1664(auVar70);
        auVar179 = ZEXT3264(local_3c0);
        auVar186 = ZEXT3264(local_340);
        auVar188 = ZEXT3264(local_3e0);
        auVar189 = ZEXT3264(local_360);
        auVar187 = ZEXT3264(local_400);
        auVar191 = ZEXT3264(local_380);
        auVar192 = ZEXT3264(local_420);
      }
      else {
        auVar86 = vmulps_avx512vl(local_120,auVar86);
        auVar87 = vfmadd213ps_avx512vl(auVar87,local_100,auVar86);
        auVar77 = vfmadd213ps_avx512vl(auVar77,local_320,auVar87);
        auVar82 = vfmadd213ps_avx512vl(auVar76,local_300,auVar77);
        auVar88 = vmulps_avx512vl(local_120,auVar88);
        auVar89 = vfmadd213ps_avx512vl(auVar89,local_100,auVar88);
        auVar70 = vfmadd213ps_fma(auVar91,local_320,auVar89);
        auVar91 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1210);
        auVar89 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1694);
        auVar88 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1b18);
        auVar76 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar25 + 0x1f9c);
        auVar85 = vfmadd213ps_avx512vl(auVar90,local_300,ZEXT1632(auVar70));
        auVar90 = vmulps_avx512vl(local_3a0,auVar76);
        auVar77 = vmulps_avx512vl(local_420,auVar76);
        auVar76 = vmulps_avx512vl(local_120,auVar76);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar88,local_400);
        auVar77 = vfmadd231ps_avx512vl(auVar77,auVar88,local_380);
        auVar88 = vfmadd231ps_avx512vl(auVar76,local_100,auVar88);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar89,local_3e0);
        auVar76 = vfmadd231ps_avx512vl(auVar77,auVar89,local_360);
        auVar77 = vfmadd231ps_avx512vl(auVar88,local_320,auVar89);
        auVar87 = vfmadd231ps_avx512vl(auVar90,auVar91,local_3c0);
        auVar76 = vfmadd231ps_avx512vl(auVar76,auVar91,local_340);
        auVar90 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1210);
        auVar89 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1b18);
        auVar88 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1f9c);
        auVar70 = vfmadd231ps_fma(auVar77,local_300,auVar91);
        auVar77._4_4_ = fVar158 * auVar88._4_4_;
        auVar77._0_4_ = fVar158 * auVar88._0_4_;
        auVar77._8_4_ = fVar158 * auVar88._8_4_;
        auVar77._12_4_ = fVar158 * auVar88._12_4_;
        auVar77._16_4_ = fVar158 * auVar88._16_4_;
        auVar77._20_4_ = fVar158 * auVar88._20_4_;
        auVar77._24_4_ = fVar158 * auVar88._24_4_;
        auVar77._28_4_ = auVar91._28_4_;
        auVar91 = vmulps_avx512vl(local_420,auVar88);
        auVar88 = vmulps_avx512vl(local_120,auVar88);
        auVar77 = vfmadd231ps_avx512vl(auVar77,auVar89,local_400);
        auVar86 = vfmadd231ps_avx512vl(auVar91,auVar89,local_380);
        auVar89 = vfmadd231ps_avx512vl(auVar88,local_100,auVar89);
        auVar91 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar25 + 0x1694);
        auVar88 = vfmadd231ps_avx512vl(auVar77,auVar91,local_3e0);
        auVar77 = vfmadd231ps_avx512vl(auVar86,auVar91,local_360);
        auVar91 = vfmadd231ps_avx512vl(auVar89,local_320,auVar91);
        auVar89 = vfmadd231ps_avx512vl(auVar88,auVar90,local_3c0);
        auVar88 = vfmadd231ps_avx512vl(auVar77,auVar90,local_340);
        auVar73 = vfmadd231ps_fma(auVar91,local_300,auVar90);
        auVar181._8_4_ = 0x7fffffff;
        auVar181._0_8_ = 0x7fffffff7fffffff;
        auVar181._12_4_ = 0x7fffffff;
        auVar181._16_4_ = 0x7fffffff;
        auVar181._20_4_ = 0x7fffffff;
        auVar181._24_4_ = 0x7fffffff;
        auVar181._28_4_ = 0x7fffffff;
        auVar90 = vandps_avx(auVar87,auVar181);
        auVar91 = vandps_avx(auVar76,auVar181);
        auVar91 = vmaxps_avx(auVar90,auVar91);
        auVar90 = vandps_avx(ZEXT1632(auVar70),auVar181);
        auVar90 = vmaxps_avx(auVar91,auVar90);
        auVar77 = vbroadcastss_avx512vl(auVar72);
        uVar61 = vcmpps_avx512vl(auVar90,auVar77,1);
        bVar65 = (bool)((byte)uVar61 & 1);
        auVar92._0_4_ = (float)((uint)bVar65 * auVar80._0_4_ | (uint)!bVar65 * auVar87._0_4_);
        bVar65 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar92._4_4_ = (float)((uint)bVar65 * auVar80._4_4_ | (uint)!bVar65 * auVar87._4_4_);
        bVar65 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar92._8_4_ = (float)((uint)bVar65 * auVar80._8_4_ | (uint)!bVar65 * auVar87._8_4_);
        bVar65 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar92._12_4_ = (float)((uint)bVar65 * auVar80._12_4_ | (uint)!bVar65 * auVar87._12_4_);
        bVar65 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar92._16_4_ = (float)((uint)bVar65 * auVar80._16_4_ | (uint)!bVar65 * auVar87._16_4_);
        bVar65 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar92._20_4_ = (float)((uint)bVar65 * auVar80._20_4_ | (uint)!bVar65 * auVar87._20_4_);
        bVar65 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar92._24_4_ = (float)((uint)bVar65 * auVar80._24_4_ | (uint)!bVar65 * auVar87._24_4_);
        bVar65 = SUB81(uVar61 >> 7,0);
        auVar92._28_4_ = (uint)bVar65 * auVar80._28_4_ | (uint)!bVar65 * auVar87._28_4_;
        bVar65 = (bool)((byte)uVar61 & 1);
        auVar93._0_4_ = (float)((uint)bVar65 * auVar81._0_4_ | (uint)!bVar65 * auVar76._0_4_);
        bVar65 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar93._4_4_ = (float)((uint)bVar65 * auVar81._4_4_ | (uint)!bVar65 * auVar76._4_4_);
        bVar65 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar93._8_4_ = (float)((uint)bVar65 * auVar81._8_4_ | (uint)!bVar65 * auVar76._8_4_);
        bVar65 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar93._12_4_ = (float)((uint)bVar65 * auVar81._12_4_ | (uint)!bVar65 * auVar76._12_4_);
        bVar65 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar93._16_4_ = (float)((uint)bVar65 * auVar81._16_4_ | (uint)!bVar65 * auVar76._16_4_);
        bVar65 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar93._20_4_ = (float)((uint)bVar65 * auVar81._20_4_ | (uint)!bVar65 * auVar76._20_4_);
        bVar65 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar93._24_4_ = (float)((uint)bVar65 * auVar81._24_4_ | (uint)!bVar65 * auVar76._24_4_);
        bVar65 = SUB81(uVar61 >> 7,0);
        auVar93._28_4_ = (uint)bVar65 * auVar81._28_4_ | (uint)!bVar65 * auVar76._28_4_;
        auVar90 = vandps_avx(auVar181,auVar89);
        auVar91 = vandps_avx(auVar88,auVar181);
        auVar91 = vmaxps_avx(auVar90,auVar91);
        auVar90 = vandps_avx(ZEXT1632(auVar73),auVar181);
        auVar90 = vmaxps_avx(auVar91,auVar90);
        uVar61 = vcmpps_avx512vl(auVar90,auVar77,1);
        bVar65 = (bool)((byte)uVar61 & 1);
        auVar94._0_4_ = (float)((uint)bVar65 * auVar80._0_4_ | (uint)!bVar65 * auVar89._0_4_);
        bVar65 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar94._4_4_ = (float)((uint)bVar65 * auVar80._4_4_ | (uint)!bVar65 * auVar89._4_4_);
        bVar65 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar94._8_4_ = (float)((uint)bVar65 * auVar80._8_4_ | (uint)!bVar65 * auVar89._8_4_);
        bVar65 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar94._12_4_ = (float)((uint)bVar65 * auVar80._12_4_ | (uint)!bVar65 * auVar89._12_4_);
        bVar65 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar94._16_4_ = (float)((uint)bVar65 * auVar80._16_4_ | (uint)!bVar65 * auVar89._16_4_);
        bVar65 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar94._20_4_ = (float)((uint)bVar65 * auVar80._20_4_ | (uint)!bVar65 * auVar89._20_4_);
        bVar65 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar94._24_4_ = (float)((uint)bVar65 * auVar80._24_4_ | (uint)!bVar65 * auVar89._24_4_);
        bVar65 = SUB81(uVar61 >> 7,0);
        auVar94._28_4_ = (uint)bVar65 * auVar80._28_4_ | (uint)!bVar65 * auVar89._28_4_;
        bVar65 = (bool)((byte)uVar61 & 1);
        auVar95._0_4_ = (float)((uint)bVar65 * auVar81._0_4_ | (uint)!bVar65 * auVar88._0_4_);
        bVar65 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar95._4_4_ = (float)((uint)bVar65 * auVar81._4_4_ | (uint)!bVar65 * auVar88._4_4_);
        bVar65 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar95._8_4_ = (float)((uint)bVar65 * auVar81._8_4_ | (uint)!bVar65 * auVar88._8_4_);
        bVar65 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar95._12_4_ = (float)((uint)bVar65 * auVar81._12_4_ | (uint)!bVar65 * auVar88._12_4_);
        bVar65 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar95._16_4_ = (float)((uint)bVar65 * auVar81._16_4_ | (uint)!bVar65 * auVar88._16_4_);
        bVar65 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar95._20_4_ = (float)((uint)bVar65 * auVar81._20_4_ | (uint)!bVar65 * auVar88._20_4_);
        bVar65 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar95._24_4_ = (float)((uint)bVar65 * auVar81._24_4_ | (uint)!bVar65 * auVar88._24_4_);
        bVar65 = SUB81(uVar61 >> 7,0);
        auVar95._28_4_ = (uint)bVar65 * auVar81._28_4_ | (uint)!bVar65 * auVar88._28_4_;
        auVar75 = vxorps_avx512vl(auVar72,auVar72);
        auVar185 = ZEXT1664(auVar75);
        auVar90 = vfmadd213ps_avx512vl(auVar92,auVar92,ZEXT1632(auVar75));
        auVar70 = vfmadd231ps_fma(auVar90,auVar93,auVar93);
        auVar89 = vrsqrt14ps_avx512vl(ZEXT1632(auVar70));
        fVar158 = auVar89._0_4_;
        fVar132 = auVar89._4_4_;
        fVar139 = auVar89._8_4_;
        fVar140 = auVar89._12_4_;
        fVar141 = auVar89._16_4_;
        fVar164 = auVar89._20_4_;
        fVar165 = auVar89._24_4_;
        auVar90._4_4_ = fVar132 * fVar132 * fVar132 * auVar70._4_4_ * -0.5;
        auVar90._0_4_ = fVar158 * fVar158 * fVar158 * auVar70._0_4_ * -0.5;
        auVar90._8_4_ = fVar139 * fVar139 * fVar139 * auVar70._8_4_ * -0.5;
        auVar90._12_4_ = fVar140 * fVar140 * fVar140 * auVar70._12_4_ * -0.5;
        auVar90._16_4_ = fVar141 * fVar141 * fVar141 * -0.0;
        auVar90._20_4_ = fVar164 * fVar164 * fVar164 * -0.0;
        auVar90._24_4_ = fVar165 * fVar165 * fVar165 * -0.0;
        auVar90._28_4_ = 0;
        auVar76 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar76,auVar89);
        auVar91._4_4_ = auVar93._4_4_ * auVar90._4_4_;
        auVar91._0_4_ = auVar93._0_4_ * auVar90._0_4_;
        auVar91._8_4_ = auVar93._8_4_ * auVar90._8_4_;
        auVar91._12_4_ = auVar93._12_4_ * auVar90._12_4_;
        auVar91._16_4_ = auVar93._16_4_ * auVar90._16_4_;
        auVar91._20_4_ = auVar93._20_4_ * auVar90._20_4_;
        auVar91._24_4_ = auVar93._24_4_ * auVar90._24_4_;
        auVar91._28_4_ = auVar89._28_4_;
        auVar89._4_4_ = auVar90._4_4_ * -auVar92._4_4_;
        auVar89._0_4_ = auVar90._0_4_ * -auVar92._0_4_;
        auVar89._8_4_ = auVar90._8_4_ * -auVar92._8_4_;
        auVar89._12_4_ = auVar90._12_4_ * -auVar92._12_4_;
        auVar89._16_4_ = auVar90._16_4_ * -auVar92._16_4_;
        auVar89._20_4_ = auVar90._20_4_ * -auVar92._20_4_;
        auVar89._24_4_ = auVar90._24_4_ * -auVar92._24_4_;
        auVar89._28_4_ = auVar92._28_4_ ^ 0x80000000;
        auVar77 = vmulps_avx512vl(auVar90,ZEXT1632(auVar75));
        auVar92 = ZEXT1632(auVar75);
        auVar88 = vfmadd213ps_avx512vl(auVar94,auVar94,auVar92);
        auVar70 = vfmadd231ps_fma(auVar88,auVar95,auVar95);
        auVar86 = vrsqrt14ps_avx512vl(ZEXT1632(auVar70));
        fVar158 = auVar86._0_4_;
        fVar132 = auVar86._4_4_;
        fVar139 = auVar86._8_4_;
        fVar140 = auVar86._12_4_;
        fVar141 = auVar86._16_4_;
        fVar164 = auVar86._20_4_;
        fVar165 = auVar86._24_4_;
        auVar88._4_4_ = fVar132 * fVar132 * fVar132 * auVar70._4_4_ * -0.5;
        auVar88._0_4_ = fVar158 * fVar158 * fVar158 * auVar70._0_4_ * -0.5;
        auVar88._8_4_ = fVar139 * fVar139 * fVar139 * auVar70._8_4_ * -0.5;
        auVar88._12_4_ = fVar140 * fVar140 * fVar140 * auVar70._12_4_ * -0.5;
        auVar88._16_4_ = fVar141 * fVar141 * fVar141 * -0.0;
        auVar88._20_4_ = fVar164 * fVar164 * fVar164 * -0.0;
        auVar88._24_4_ = fVar165 * fVar165 * fVar165 * -0.0;
        auVar88._28_4_ = 0;
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar76,auVar86);
        auVar87._4_4_ = auVar95._4_4_ * auVar88._4_4_;
        auVar87._0_4_ = auVar95._0_4_ * auVar88._0_4_;
        auVar87._8_4_ = auVar95._8_4_ * auVar88._8_4_;
        auVar87._12_4_ = auVar95._12_4_ * auVar88._12_4_;
        auVar87._16_4_ = auVar95._16_4_ * auVar88._16_4_;
        auVar87._20_4_ = auVar95._20_4_ * auVar88._20_4_;
        auVar87._24_4_ = auVar95._24_4_ * auVar88._24_4_;
        auVar87._28_4_ = auVar86._28_4_;
        auVar86._4_4_ = -auVar94._4_4_ * auVar88._4_4_;
        auVar86._0_4_ = -auVar94._0_4_ * auVar88._0_4_;
        auVar86._8_4_ = -auVar94._8_4_ * auVar88._8_4_;
        auVar86._12_4_ = -auVar94._12_4_ * auVar88._12_4_;
        auVar86._16_4_ = -auVar94._16_4_ * auVar88._16_4_;
        auVar86._20_4_ = -auVar94._20_4_ * auVar88._20_4_;
        auVar86._24_4_ = -auVar94._24_4_ * auVar88._24_4_;
        auVar86._28_4_ = auVar90._28_4_;
        auVar90 = vmulps_avx512vl(auVar88,auVar92);
        auVar88 = vfmadd213ps_avx512vl(auVar91,auVar83,auVar78);
        auVar76 = vfmadd213ps_avx512vl(auVar89,auVar83,auVar79);
        auVar80 = vfmadd213ps_avx512vl(auVar77,auVar83,auVar85);
        auVar81 = vfmadd213ps_avx512vl(auVar87,ZEXT1632(auVar74),ZEXT1632(auVar22));
        auVar91 = vfnmadd213ps_avx512vl(auVar91,auVar83,auVar78);
        auVar78 = ZEXT1632(auVar74);
        auVar70 = vfmadd213ps_fma(auVar86,auVar78,ZEXT1632(auVar23));
        auVar89 = vfnmadd213ps_avx512vl(auVar89,auVar83,auVar79);
        auVar73 = vfmadd213ps_fma(auVar90,auVar78,auVar82);
        auVar77 = vfnmadd231ps_avx512vl(auVar85,auVar83,auVar77);
        auVar21 = vfnmadd213ps_fma(auVar87,auVar78,ZEXT1632(auVar22));
        auVar22 = vfnmadd213ps_fma(auVar86,auVar78,ZEXT1632(auVar23));
        auVar23 = vfnmadd231ps_fma(auVar82,ZEXT1632(auVar74),auVar90);
        auVar87 = vsubps_avx512vl(auVar81,auVar91);
        auVar90 = vsubps_avx(ZEXT1632(auVar70),auVar89);
        auVar86 = vsubps_avx512vl(ZEXT1632(auVar73),auVar77);
        auVar78 = vmulps_avx512vl(auVar90,auVar77);
        auVar20 = vfmsub231ps_fma(auVar78,auVar89,auVar86);
        auVar78._4_4_ = auVar91._4_4_ * auVar86._4_4_;
        auVar78._0_4_ = auVar91._0_4_ * auVar86._0_4_;
        auVar78._8_4_ = auVar91._8_4_ * auVar86._8_4_;
        auVar78._12_4_ = auVar91._12_4_ * auVar86._12_4_;
        auVar78._16_4_ = auVar91._16_4_ * auVar86._16_4_;
        auVar78._20_4_ = auVar91._20_4_ * auVar86._20_4_;
        auVar78._24_4_ = auVar91._24_4_ * auVar86._24_4_;
        auVar78._28_4_ = auVar86._28_4_;
        auVar86 = vfmsub231ps_avx512vl(auVar78,auVar77,auVar87);
        auVar79._4_4_ = auVar89._4_4_ * auVar87._4_4_;
        auVar79._0_4_ = auVar89._0_4_ * auVar87._0_4_;
        auVar79._8_4_ = auVar89._8_4_ * auVar87._8_4_;
        auVar79._12_4_ = auVar89._12_4_ * auVar87._12_4_;
        auVar79._16_4_ = auVar89._16_4_ * auVar87._16_4_;
        auVar79._20_4_ = auVar89._20_4_ * auVar87._20_4_;
        auVar79._24_4_ = auVar89._24_4_ * auVar87._24_4_;
        auVar79._28_4_ = auVar87._28_4_;
        auVar184 = vfmsub231ps_fma(auVar79,auVar91,auVar90);
        auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar184),auVar92,auVar86);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar92,ZEXT1632(auVar20));
        auVar79 = ZEXT1632(auVar75);
        uVar61 = vcmpps_avx512vl(auVar90,auVar79,2);
        bVar59 = (byte)uVar61;
        auVar96._0_4_ =
             (float)((uint)(bVar59 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar21._0_4_)
        ;
        bVar65 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar96._4_4_ = (float)((uint)bVar65 * auVar88._4_4_ | (uint)!bVar65 * auVar21._4_4_);
        bVar65 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar96._8_4_ = (float)((uint)bVar65 * auVar88._8_4_ | (uint)!bVar65 * auVar21._8_4_);
        bVar65 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar96._12_4_ = (float)((uint)bVar65 * auVar88._12_4_ | (uint)!bVar65 * auVar21._12_4_);
        fVar158 = (float)((uint)((byte)(uVar61 >> 4) & 1) * auVar88._16_4_);
        auVar96._16_4_ = fVar158;
        fVar139 = (float)((uint)((byte)(uVar61 >> 5) & 1) * auVar88._20_4_);
        auVar96._20_4_ = fVar139;
        fVar132 = (float)((uint)((byte)(uVar61 >> 6) & 1) * auVar88._24_4_);
        auVar96._24_4_ = fVar132;
        auVar96._28_4_ = (uint)(byte)(uVar61 >> 7) * auVar88._28_4_;
        auVar97._0_4_ =
             (float)((uint)(bVar59 & 1) * auVar76._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar22._0_4_)
        ;
        bVar65 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar97._4_4_ = (float)((uint)bVar65 * auVar76._4_4_ | (uint)!bVar65 * auVar22._4_4_);
        bVar65 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar97._8_4_ = (float)((uint)bVar65 * auVar76._8_4_ | (uint)!bVar65 * auVar22._8_4_);
        bVar65 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar97._12_4_ = (float)((uint)bVar65 * auVar76._12_4_ | (uint)!bVar65 * auVar22._12_4_);
        fVar164 = (float)((uint)((byte)(uVar61 >> 4) & 1) * auVar76._16_4_);
        auVar97._16_4_ = fVar164;
        fVar140 = (float)((uint)((byte)(uVar61 >> 5) & 1) * auVar76._20_4_);
        auVar97._20_4_ = fVar140;
        fVar141 = (float)((uint)((byte)(uVar61 >> 6) & 1) * auVar76._24_4_);
        auVar97._24_4_ = fVar141;
        auVar97._28_4_ = (uint)(byte)(uVar61 >> 7) * auVar76._28_4_;
        auVar98._0_4_ =
             (float)((uint)(bVar59 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar23._0_4_)
        ;
        bVar65 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar98._4_4_ = (float)((uint)bVar65 * auVar80._4_4_ | (uint)!bVar65 * auVar23._4_4_);
        bVar65 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar98._8_4_ = (float)((uint)bVar65 * auVar80._8_4_ | (uint)!bVar65 * auVar23._8_4_);
        bVar65 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar98._12_4_ = (float)((uint)bVar65 * auVar80._12_4_ | (uint)!bVar65 * auVar23._12_4_);
        fVar167 = (float)((uint)((byte)(uVar61 >> 4) & 1) * auVar80._16_4_);
        auVar98._16_4_ = fVar167;
        fVar166 = (float)((uint)((byte)(uVar61 >> 5) & 1) * auVar80._20_4_);
        auVar98._20_4_ = fVar166;
        fVar165 = (float)((uint)((byte)(uVar61 >> 6) & 1) * auVar80._24_4_);
        auVar98._24_4_ = fVar165;
        iVar1 = (uint)(byte)(uVar61 >> 7) * auVar80._28_4_;
        auVar98._28_4_ = iVar1;
        auVar88 = vblendmps_avx512vl(auVar91,auVar81);
        auVar99._0_4_ =
             (uint)(bVar59 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar20._0_4_;
        bVar65 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar99._4_4_ = (uint)bVar65 * auVar88._4_4_ | (uint)!bVar65 * auVar20._4_4_;
        bVar65 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar99._8_4_ = (uint)bVar65 * auVar88._8_4_ | (uint)!bVar65 * auVar20._8_4_;
        bVar65 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar99._12_4_ = (uint)bVar65 * auVar88._12_4_ | (uint)!bVar65 * auVar20._12_4_;
        auVar99._16_4_ = (uint)((byte)(uVar61 >> 4) & 1) * auVar88._16_4_;
        auVar99._20_4_ = (uint)((byte)(uVar61 >> 5) & 1) * auVar88._20_4_;
        auVar99._24_4_ = (uint)((byte)(uVar61 >> 6) & 1) * auVar88._24_4_;
        auVar99._28_4_ = (uint)(byte)(uVar61 >> 7) * auVar88._28_4_;
        auVar88 = vblendmps_avx512vl(auVar89,ZEXT1632(auVar70));
        auVar100._0_4_ =
             (float)((uint)(bVar59 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar76._0_4_)
        ;
        bVar65 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar100._4_4_ = (float)((uint)bVar65 * auVar88._4_4_ | (uint)!bVar65 * auVar76._4_4_);
        bVar65 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar100._8_4_ = (float)((uint)bVar65 * auVar88._8_4_ | (uint)!bVar65 * auVar76._8_4_);
        bVar65 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar100._12_4_ = (float)((uint)bVar65 * auVar88._12_4_ | (uint)!bVar65 * auVar76._12_4_);
        bVar65 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar100._16_4_ = (float)((uint)bVar65 * auVar88._16_4_ | (uint)!bVar65 * auVar76._16_4_);
        bVar65 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar100._20_4_ = (float)((uint)bVar65 * auVar88._20_4_ | (uint)!bVar65 * auVar76._20_4_);
        bVar65 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar100._24_4_ = (float)((uint)bVar65 * auVar88._24_4_ | (uint)!bVar65 * auVar76._24_4_);
        bVar65 = SUB81(uVar61 >> 7,0);
        auVar100._28_4_ = (uint)bVar65 * auVar88._28_4_ | (uint)!bVar65 * auVar76._28_4_;
        auVar88 = vblendmps_avx512vl(auVar77,ZEXT1632(auVar73));
        auVar101._0_4_ =
             (float)((uint)(bVar59 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar80._0_4_)
        ;
        bVar65 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar101._4_4_ = (float)((uint)bVar65 * auVar88._4_4_ | (uint)!bVar65 * auVar80._4_4_);
        bVar65 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar101._8_4_ = (float)((uint)bVar65 * auVar88._8_4_ | (uint)!bVar65 * auVar80._8_4_);
        bVar65 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar101._12_4_ = (float)((uint)bVar65 * auVar88._12_4_ | (uint)!bVar65 * auVar80._12_4_);
        bVar65 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar101._16_4_ = (float)((uint)bVar65 * auVar88._16_4_ | (uint)!bVar65 * auVar80._16_4_);
        bVar65 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar101._20_4_ = (float)((uint)bVar65 * auVar88._20_4_ | (uint)!bVar65 * auVar80._20_4_);
        bVar65 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar101._24_4_ = (float)((uint)bVar65 * auVar88._24_4_ | (uint)!bVar65 * auVar80._24_4_);
        bVar65 = SUB81(uVar61 >> 7,0);
        auVar101._28_4_ = (uint)bVar65 * auVar88._28_4_ | (uint)!bVar65 * auVar80._28_4_;
        auVar102._0_4_ =
             (uint)(bVar59 & 1) * (int)auVar91._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar81._0_4_;
        bVar65 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar102._4_4_ = (uint)bVar65 * (int)auVar91._4_4_ | (uint)!bVar65 * auVar81._4_4_;
        bVar65 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar102._8_4_ = (uint)bVar65 * (int)auVar91._8_4_ | (uint)!bVar65 * auVar81._8_4_;
        bVar65 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar102._12_4_ = (uint)bVar65 * (int)auVar91._12_4_ | (uint)!bVar65 * auVar81._12_4_;
        bVar65 = (bool)((byte)(uVar61 >> 4) & 1);
        auVar102._16_4_ = (uint)bVar65 * (int)auVar91._16_4_ | (uint)!bVar65 * auVar81._16_4_;
        bVar65 = (bool)((byte)(uVar61 >> 5) & 1);
        auVar102._20_4_ = (uint)bVar65 * (int)auVar91._20_4_ | (uint)!bVar65 * auVar81._20_4_;
        bVar65 = (bool)((byte)(uVar61 >> 6) & 1);
        auVar102._24_4_ = (uint)bVar65 * (int)auVar91._24_4_ | (uint)!bVar65 * auVar81._24_4_;
        bVar65 = SUB81(uVar61 >> 7,0);
        auVar102._28_4_ = (uint)bVar65 * auVar91._28_4_ | (uint)!bVar65 * auVar81._28_4_;
        auVar103._0_4_ =
             (uint)(bVar59 & 1) * (int)auVar89._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar70._0_4_;
        bVar65 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar103._4_4_ = (uint)bVar65 * (int)auVar89._4_4_ | (uint)!bVar65 * auVar70._4_4_;
        bVar65 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar103._8_4_ = (uint)bVar65 * (int)auVar89._8_4_ | (uint)!bVar65 * auVar70._8_4_;
        bVar65 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar103._12_4_ = (uint)bVar65 * (int)auVar89._12_4_ | (uint)!bVar65 * auVar70._12_4_;
        auVar103._16_4_ = (uint)((byte)(uVar61 >> 4) & 1) * (int)auVar89._16_4_;
        auVar103._20_4_ = (uint)((byte)(uVar61 >> 5) & 1) * (int)auVar89._20_4_;
        auVar103._24_4_ = (uint)((byte)(uVar61 >> 6) & 1) * (int)auVar89._24_4_;
        auVar103._28_4_ = (uint)(byte)(uVar61 >> 7) * auVar89._28_4_;
        auVar104._0_4_ =
             (uint)(bVar59 & 1) * auVar77._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar73._0_4_;
        bVar65 = (bool)((byte)(uVar61 >> 1) & 1);
        auVar104._4_4_ = (uint)bVar65 * auVar77._4_4_ | (uint)!bVar65 * auVar73._4_4_;
        bVar65 = (bool)((byte)(uVar61 >> 2) & 1);
        auVar104._8_4_ = (uint)bVar65 * auVar77._8_4_ | (uint)!bVar65 * auVar73._8_4_;
        bVar65 = (bool)((byte)(uVar61 >> 3) & 1);
        auVar104._12_4_ = (uint)bVar65 * auVar77._12_4_ | (uint)!bVar65 * auVar73._12_4_;
        auVar104._16_4_ = (uint)((byte)(uVar61 >> 4) & 1) * auVar77._16_4_;
        auVar104._20_4_ = (uint)((byte)(uVar61 >> 5) & 1) * auVar77._20_4_;
        auVar104._24_4_ = (uint)((byte)(uVar61 >> 6) & 1) * auVar77._24_4_;
        iVar2 = (uint)(byte)(uVar61 >> 7) * auVar77._28_4_;
        auVar104._28_4_ = iVar2;
        auVar87 = vsubps_avx512vl(auVar102,auVar96);
        auVar91 = vsubps_avx(auVar103,auVar97);
        auVar89 = vsubps_avx(auVar104,auVar98);
        auVar88 = vsubps_avx(auVar96,auVar99);
        auVar76 = vsubps_avx(auVar97,auVar100);
        auVar77 = vsubps_avx(auVar98,auVar101);
        auVar80._4_4_ = auVar89._4_4_ * auVar96._4_4_;
        auVar80._0_4_ = auVar89._0_4_ * auVar96._0_4_;
        auVar80._8_4_ = auVar89._8_4_ * auVar96._8_4_;
        auVar80._12_4_ = auVar89._12_4_ * auVar96._12_4_;
        auVar80._16_4_ = auVar89._16_4_ * fVar158;
        auVar80._20_4_ = auVar89._20_4_ * fVar139;
        auVar80._24_4_ = auVar89._24_4_ * fVar132;
        auVar80._28_4_ = iVar2;
        auVar70 = vfmsub231ps_fma(auVar80,auVar98,auVar87);
        auVar81._4_4_ = auVar97._4_4_ * auVar87._4_4_;
        auVar81._0_4_ = auVar97._0_4_ * auVar87._0_4_;
        auVar81._8_4_ = auVar97._8_4_ * auVar87._8_4_;
        auVar81._12_4_ = auVar97._12_4_ * auVar87._12_4_;
        auVar81._16_4_ = fVar164 * auVar87._16_4_;
        auVar81._20_4_ = fVar140 * auVar87._20_4_;
        auVar81._24_4_ = fVar141 * auVar87._24_4_;
        auVar81._28_4_ = auVar90._28_4_;
        auVar73 = vfmsub231ps_fma(auVar81,auVar96,auVar91);
        auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar73),auVar79,ZEXT1632(auVar70));
        auVar151._0_4_ = auVar91._0_4_ * auVar98._0_4_;
        auVar151._4_4_ = auVar91._4_4_ * auVar98._4_4_;
        auVar151._8_4_ = auVar91._8_4_ * auVar98._8_4_;
        auVar151._12_4_ = auVar91._12_4_ * auVar98._12_4_;
        auVar151._16_4_ = auVar91._16_4_ * fVar167;
        auVar151._20_4_ = auVar91._20_4_ * fVar166;
        auVar151._24_4_ = auVar91._24_4_ * fVar165;
        auVar151._28_4_ = 0;
        auVar70 = vfmsub231ps_fma(auVar151,auVar97,auVar89);
        auVar86 = vfmadd231ps_avx512vl(auVar90,auVar79,ZEXT1632(auVar70));
        auVar90 = vmulps_avx512vl(auVar77,auVar99);
        auVar90 = vfmsub231ps_avx512vl(auVar90,auVar88,auVar101);
        auVar85._4_4_ = auVar76._4_4_ * auVar101._4_4_;
        auVar85._0_4_ = auVar76._0_4_ * auVar101._0_4_;
        auVar85._8_4_ = auVar76._8_4_ * auVar101._8_4_;
        auVar85._12_4_ = auVar76._12_4_ * auVar101._12_4_;
        auVar85._16_4_ = auVar76._16_4_ * auVar101._16_4_;
        auVar85._20_4_ = auVar76._20_4_ * auVar101._20_4_;
        auVar85._24_4_ = auVar76._24_4_ * auVar101._24_4_;
        auVar85._28_4_ = auVar101._28_4_;
        auVar70 = vfmsub231ps_fma(auVar85,auVar100,auVar77);
        auVar152._0_4_ = auVar100._0_4_ * auVar88._0_4_;
        auVar152._4_4_ = auVar100._4_4_ * auVar88._4_4_;
        auVar152._8_4_ = auVar100._8_4_ * auVar88._8_4_;
        auVar152._12_4_ = auVar100._12_4_ * auVar88._12_4_;
        auVar152._16_4_ = auVar100._16_4_ * auVar88._16_4_;
        auVar152._20_4_ = auVar100._20_4_ * auVar88._20_4_;
        auVar152._24_4_ = auVar100._24_4_ * auVar88._24_4_;
        auVar152._28_4_ = 0;
        auVar73 = vfmsub231ps_fma(auVar152,auVar76,auVar99);
        auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar73),auVar79,auVar90);
        auVar78 = vfmadd231ps_avx512vl(auVar90,auVar79,ZEXT1632(auVar70));
        auVar90 = vmaxps_avx(auVar86,auVar78);
        uVar133 = vcmpps_avx512vl(auVar90,auVar79,2);
        bVar67 = bVar67 & (byte)uVar133;
        auVar179 = ZEXT3264(local_3c0);
        auVar186 = ZEXT3264(local_340);
        auVar188 = ZEXT3264(local_3e0);
        auVar189 = ZEXT3264(local_360);
        auVar187 = ZEXT3264(local_400);
        auVar191 = ZEXT3264(local_380);
        auVar190 = ZEXT3264(local_3a0);
        auVar192 = ZEXT3264(local_420);
        if (bVar67 == 0) {
          auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar183 = ZEXT3264(auVar90);
        }
        else {
          auVar32._4_4_ = auVar77._4_4_ * auVar91._4_4_;
          auVar32._0_4_ = auVar77._0_4_ * auVar91._0_4_;
          auVar32._8_4_ = auVar77._8_4_ * auVar91._8_4_;
          auVar32._12_4_ = auVar77._12_4_ * auVar91._12_4_;
          auVar32._16_4_ = auVar77._16_4_ * auVar91._16_4_;
          auVar32._20_4_ = auVar77._20_4_ * auVar91._20_4_;
          auVar32._24_4_ = auVar77._24_4_ * auVar91._24_4_;
          auVar32._28_4_ = auVar90._28_4_;
          auVar20 = vfmsub231ps_fma(auVar32,auVar76,auVar89);
          auVar33._4_4_ = auVar89._4_4_ * auVar88._4_4_;
          auVar33._0_4_ = auVar89._0_4_ * auVar88._0_4_;
          auVar33._8_4_ = auVar89._8_4_ * auVar88._8_4_;
          auVar33._12_4_ = auVar89._12_4_ * auVar88._12_4_;
          auVar33._16_4_ = auVar89._16_4_ * auVar88._16_4_;
          auVar33._20_4_ = auVar89._20_4_ * auVar88._20_4_;
          auVar33._24_4_ = auVar89._24_4_ * auVar88._24_4_;
          auVar33._28_4_ = auVar89._28_4_;
          auVar73 = vfmsub231ps_fma(auVar33,auVar87,auVar77);
          auVar34._4_4_ = auVar76._4_4_ * auVar87._4_4_;
          auVar34._0_4_ = auVar76._0_4_ * auVar87._0_4_;
          auVar34._8_4_ = auVar76._8_4_ * auVar87._8_4_;
          auVar34._12_4_ = auVar76._12_4_ * auVar87._12_4_;
          auVar34._16_4_ = auVar76._16_4_ * auVar87._16_4_;
          auVar34._20_4_ = auVar76._20_4_ * auVar87._20_4_;
          auVar34._24_4_ = auVar76._24_4_ * auVar87._24_4_;
          auVar34._28_4_ = auVar76._28_4_;
          auVar184 = vfmsub231ps_fma(auVar34,auVar88,auVar91);
          auVar70 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar73),ZEXT1632(auVar184));
          auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar70),ZEXT1632(auVar20),auVar79);
          auVar90 = vrcp14ps_avx512vl(auVar91);
          auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar183 = ZEXT3264(auVar89);
          auVar88 = vfnmadd213ps_avx512vl(auVar90,auVar91,auVar89);
          auVar70 = vfmadd132ps_fma(auVar88,auVar90,auVar90);
          auVar35._4_4_ = auVar184._4_4_ * auVar98._4_4_;
          auVar35._0_4_ = auVar184._0_4_ * auVar98._0_4_;
          auVar35._8_4_ = auVar184._8_4_ * auVar98._8_4_;
          auVar35._12_4_ = auVar184._12_4_ * auVar98._12_4_;
          auVar35._16_4_ = fVar167 * 0.0;
          auVar35._20_4_ = fVar166 * 0.0;
          auVar35._24_4_ = fVar165 * 0.0;
          auVar35._28_4_ = iVar1;
          auVar73 = vfmadd231ps_fma(auVar35,auVar97,ZEXT1632(auVar73));
          auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar96,ZEXT1632(auVar20));
          fVar132 = auVar70._0_4_;
          fVar139 = auVar70._4_4_;
          fVar140 = auVar70._8_4_;
          fVar141 = auVar70._12_4_;
          local_200 = ZEXT1632(CONCAT412(auVar73._12_4_ * fVar141,
                                         CONCAT48(auVar73._8_4_ * fVar140,
                                                  CONCAT44(auVar73._4_4_ * fVar139,
                                                           auVar73._0_4_ * fVar132))));
          auVar171._8_4_ = 3;
          auVar171._0_8_ = 0x300000003;
          auVar171._12_4_ = 3;
          auVar171._16_4_ = 3;
          auVar171._20_4_ = 3;
          auVar171._24_4_ = 3;
          auVar171._28_4_ = 3;
          auVar90 = vpermps_avx2(auVar171,ZEXT1632((undefined1  [16])aVar5));
          uVar133 = vcmpps_avx512vl(auVar90,local_200,2);
          fVar158 = local_520->tfar;
          auVar27._4_4_ = fVar158;
          auVar27._0_4_ = fVar158;
          auVar27._8_4_ = fVar158;
          auVar27._12_4_ = fVar158;
          auVar27._16_4_ = fVar158;
          auVar27._20_4_ = fVar158;
          auVar27._24_4_ = fVar158;
          auVar27._28_4_ = fVar158;
          uVar24 = vcmpps_avx512vl(local_200,auVar27,2);
          bVar67 = (byte)uVar133 & (byte)uVar24 & bVar67;
          if (bVar67 != 0) {
            uVar133 = vcmpps_avx512vl(auVar91,auVar79,4);
            bVar67 = bVar67 & (byte)uVar133;
            if (bVar67 != 0) {
              fVar158 = auVar86._0_4_ * fVar132;
              fVar164 = auVar86._4_4_ * fVar139;
              auVar36._4_4_ = fVar164;
              auVar36._0_4_ = fVar158;
              fVar165 = auVar86._8_4_ * fVar140;
              auVar36._8_4_ = fVar165;
              fVar166 = auVar86._12_4_ * fVar141;
              auVar36._12_4_ = fVar166;
              fVar167 = auVar86._16_4_ * 0.0;
              auVar36._16_4_ = fVar167;
              fVar168 = auVar86._20_4_ * 0.0;
              auVar36._20_4_ = fVar168;
              fVar169 = auVar86._24_4_ * 0.0;
              auVar36._24_4_ = fVar169;
              auVar36._28_4_ = auVar91._28_4_;
              auVar90 = vsubps_avx512vl(auVar89,auVar36);
              local_240._0_4_ =
                   (float)((uint)(bVar59 & 1) * (int)fVar158 |
                          (uint)!(bool)(bVar59 & 1) * auVar90._0_4_);
              bVar65 = (bool)((byte)(uVar61 >> 1) & 1);
              local_240._4_4_ = (float)((uint)bVar65 * (int)fVar164 | (uint)!bVar65 * auVar90._4_4_)
              ;
              bVar65 = (bool)((byte)(uVar61 >> 2) & 1);
              local_240._8_4_ = (float)((uint)bVar65 * (int)fVar165 | (uint)!bVar65 * auVar90._8_4_)
              ;
              bVar65 = (bool)((byte)(uVar61 >> 3) & 1);
              local_240._12_4_ =
                   (float)((uint)bVar65 * (int)fVar166 | (uint)!bVar65 * auVar90._12_4_);
              bVar65 = (bool)((byte)(uVar61 >> 4) & 1);
              local_240._16_4_ =
                   (float)((uint)bVar65 * (int)fVar167 | (uint)!bVar65 * auVar90._16_4_);
              bVar65 = (bool)((byte)(uVar61 >> 5) & 1);
              local_240._20_4_ =
                   (float)((uint)bVar65 * (int)fVar168 | (uint)!bVar65 * auVar90._20_4_);
              bVar65 = (bool)((byte)(uVar61 >> 6) & 1);
              local_240._24_4_ =
                   (float)((uint)bVar65 * (int)fVar169 | (uint)!bVar65 * auVar90._24_4_);
              bVar65 = SUB81(uVar61 >> 7,0);
              local_240._28_4_ =
                   (float)((uint)bVar65 * auVar91._28_4_ | (uint)!bVar65 * auVar90._28_4_);
              auVar90 = vsubps_avx512vl(ZEXT1632(auVar74),auVar83);
              auVar90 = vfmadd213ps_avx512vl(auVar90,local_240,auVar83);
              auVar130._0_4_ = auVar90._0_4_ + auVar90._0_4_;
              auVar130._4_4_ = auVar90._4_4_ + auVar90._4_4_;
              auVar130._8_4_ = auVar90._8_4_ + auVar90._8_4_;
              auVar130._12_4_ = auVar90._12_4_ + auVar90._12_4_;
              auVar130._16_4_ = auVar90._16_4_ + auVar90._16_4_;
              auVar130._20_4_ = auVar90._20_4_ + auVar90._20_4_;
              auVar130._24_4_ = auVar90._24_4_ + auVar90._24_4_;
              fVar164 = auVar90._28_4_;
              auVar130._28_4_ = fVar164 + fVar164;
              fVar158 = local_508->depth_scale;
              auVar83._4_4_ = fVar158;
              auVar83._0_4_ = fVar158;
              auVar83._8_4_ = fVar158;
              auVar83._12_4_ = fVar158;
              auVar83._16_4_ = fVar158;
              auVar83._20_4_ = fVar158;
              auVar83._24_4_ = fVar158;
              auVar83._28_4_ = fVar158;
              auVar90 = vmulps_avx512vl(auVar130,auVar83);
              uVar133 = vcmpps_avx512vl(local_200,auVar90,6);
              if (((byte)uVar133 & bVar67) != 0) {
                auVar8._0_4_ = local_520->tfar;
                auVar8._4_4_ = local_520->mask;
                auVar8._8_4_ = local_520->id;
                auVar8._12_4_ = local_520->flags;
                uVar60 = vextractps_avx(auVar8,1);
                fVar132 = auVar78._0_4_ * fVar132;
                fVar139 = auVar78._4_4_ * fVar139;
                auVar37._4_4_ = fVar139;
                auVar37._0_4_ = fVar132;
                fVar140 = auVar78._8_4_ * fVar140;
                auVar37._8_4_ = fVar140;
                fVar141 = auVar78._12_4_ * fVar141;
                auVar37._12_4_ = fVar141;
                fVar158 = auVar78._16_4_ * 0.0;
                auVar37._16_4_ = fVar158;
                fVar165 = auVar78._20_4_ * 0.0;
                auVar37._20_4_ = fVar165;
                fVar166 = auVar78._24_4_ * 0.0;
                auVar37._24_4_ = fVar166;
                auVar37._28_4_ = fVar164;
                auVar90 = vsubps_avx512vl(auVar89,auVar37);
                auVar105._0_4_ =
                     (uint)(bVar59 & 1) * (int)fVar132 | (uint)!(bool)(bVar59 & 1) * auVar90._0_4_;
                bVar65 = (bool)((byte)(uVar61 >> 1) & 1);
                auVar105._4_4_ = (uint)bVar65 * (int)fVar139 | (uint)!bVar65 * auVar90._4_4_;
                bVar65 = (bool)((byte)(uVar61 >> 2) & 1);
                auVar105._8_4_ = (uint)bVar65 * (int)fVar140 | (uint)!bVar65 * auVar90._8_4_;
                bVar65 = (bool)((byte)(uVar61 >> 3) & 1);
                auVar105._12_4_ = (uint)bVar65 * (int)fVar141 | (uint)!bVar65 * auVar90._12_4_;
                bVar65 = (bool)((byte)(uVar61 >> 4) & 1);
                auVar105._16_4_ = (uint)bVar65 * (int)fVar158 | (uint)!bVar65 * auVar90._16_4_;
                bVar65 = (bool)((byte)(uVar61 >> 5) & 1);
                auVar105._20_4_ = (uint)bVar65 * (int)fVar165 | (uint)!bVar65 * auVar90._20_4_;
                bVar65 = (bool)((byte)(uVar61 >> 6) & 1);
                auVar105._24_4_ = (uint)bVar65 * (int)fVar166 | (uint)!bVar65 * auVar90._24_4_;
                bVar65 = SUB81(uVar61 >> 7,0);
                auVar105._28_4_ = (uint)bVar65 * (int)fVar164 | (uint)!bVar65 * auVar90._28_4_;
                auVar28._8_4_ = 0x40000000;
                auVar28._0_8_ = 0x4000000040000000;
                auVar28._12_4_ = 0x40000000;
                auVar28._16_4_ = 0x40000000;
                auVar28._20_4_ = 0x40000000;
                auVar28._24_4_ = 0x40000000;
                auVar28._28_4_ = 0x40000000;
                local_220 = vfmsub132ps_avx512vl(auVar105,auVar89,auVar28);
                local_1e0 = 0;
                local_1dc = iVar11;
                local_1d0 = local_450;
                local_1c0 = local_460;
                local_1b0 = *(undefined8 *)*pauVar3;
                uStack_1a8 = *(undefined8 *)(*pauVar3 + 8);
                if ((pGVar12->mask & uVar60) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar65 = true, pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar158 = 1.0 / auVar84._0_4_;
                    local_180[0] = fVar158 * (local_240._0_4_ + 0.0);
                    local_180[1] = fVar158 * (local_240._4_4_ + 1.0);
                    local_180[2] = fVar158 * (local_240._8_4_ + 2.0);
                    local_180[3] = fVar158 * (local_240._12_4_ + 3.0);
                    fStack_170 = fVar158 * (local_240._16_4_ + 4.0);
                    fStack_16c = fVar158 * (local_240._20_4_ + 5.0);
                    fStack_168 = fVar158 * (local_240._24_4_ + 6.0);
                    fStack_164 = local_240._28_4_ + 7.0;
                    local_160 = local_220;
                    local_140 = local_200;
                    lVar62 = 0;
                    uVar63 = (ulong)((byte)uVar133 & bVar67);
                    for (uVar61 = uVar63; (uVar61 & 1) == 0;
                        uVar61 = uVar61 >> 1 | 0x8000000000000000) {
                      lVar62 = lVar62 + 1;
                    }
                    local_4c0 = auVar72;
                    local_440 = auVar8;
                    do {
                      auVar184 = auVar185._0_16_;
                      local_2a0._0_8_ = uVar63;
                      local_4a4 = local_180[lVar62];
                      local_4a0 = *(undefined4 *)(local_160 + lVar62 * 4);
                      local_280._0_8_ = lVar62;
                      local_520->tfar = *(float *)(local_140 + lVar62 * 4);
                      local_4f0.context = context->user;
                      fVar158 = 1.0 - local_4a4;
                      auVar20 = vfnmadd231ss_fma(ZEXT416((uint)(local_4a4 * (fVar158 + fVar158))),
                                                 ZEXT416((uint)fVar158),ZEXT416((uint)fVar158));
                      auVar73 = ZEXT416((uint)local_4a4);
                      auVar72 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar73,
                                                ZEXT416(0xc0a00000));
                      auVar70 = vfmadd231ss_fma(ZEXT416((uint)(local_4a4 * local_4a4 * 3.0)),
                                                ZEXT416((uint)(local_4a4 + local_4a4)),auVar72);
                      auVar72 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar73,
                                                ZEXT416(0x40000000));
                      auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar158 * fVar158 * -3.0)),
                                                ZEXT416((uint)(fVar158 + fVar158)),auVar72);
                      auVar73 = vfmadd231ss_fma(ZEXT416((uint)(local_4a4 * local_4a4)),auVar73,
                                                ZEXT416((uint)(fVar158 * -2.0)));
                      fVar158 = auVar20._0_4_ * 0.5;
                      fVar132 = auVar70._0_4_ * 0.5;
                      fVar139 = auVar72._0_4_ * 0.5;
                      fVar140 = auVar73._0_4_ * 0.5;
                      auVar144._0_4_ = fVar140 * local_430;
                      auVar144._4_4_ = fVar140 * fStack_42c;
                      auVar144._8_4_ = fVar140 * fStack_428;
                      auVar144._12_4_ = fVar140 * fStack_424;
                      auVar156._4_4_ = fVar139;
                      auVar156._0_4_ = fVar139;
                      auVar156._8_4_ = fVar139;
                      auVar156._12_4_ = fVar139;
                      auVar56._8_8_ = uStack_4f8;
                      auVar56._0_8_ = local_500;
                      auVar72 = vfmadd132ps_fma(auVar156,auVar144,auVar56);
                      auVar145._4_4_ = fVar132;
                      auVar145._0_4_ = fVar132;
                      auVar145._8_4_ = fVar132;
                      auVar145._12_4_ = fVar132;
                      auVar72 = vfmadd213ps_fma(auVar145,local_460,auVar72);
                      auVar137._4_4_ = fVar158;
                      auVar137._0_4_ = fVar158;
                      auVar137._8_4_ = fVar158;
                      auVar137._12_4_ = fVar158;
                      auVar72 = vfmadd213ps_fma(auVar137,local_450,auVar72);
                      local_4b0 = vmovlps_avx(auVar72);
                      local_4a8 = vextractps_avx(auVar72,2);
                      local_49c = (int)local_468;
                      local_498 = (int)local_510;
                      local_494 = (local_4f0.context)->instID[0];
                      local_490 = (local_4f0.context)->instPrimID[0];
                      local_524 = -1;
                      local_4f0.valid = &local_524;
                      local_4f0.geometryUserPtr = pGVar12->userPtr;
                      local_4f0.ray = (RTCRayN *)local_520;
                      local_4f0.hit = (RTCHitN *)&local_4b0;
                      local_4f0.N = 1;
                      if ((pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*pGVar12->occlusionFilterN)(&local_4f0), *local_4f0.valid != 0)) {
                        p_Var13 = context->args->filter;
                        if ((p_Var13 == (RTCFilterFunctionN)0x0) ||
                           ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                              RTC_RAY_QUERY_FLAG_INCOHERENT &&
                             (((pGVar12->field_8).field_0x2 & 0x40) == 0)) ||
                            ((*p_Var13)(&local_4f0), *local_4f0.valid != 0)))) {
                          bVar65 = true;
                          auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar183 = ZEXT3264(auVar90);
                          auVar72 = vxorps_avx512vl(auVar184,auVar184);
                          auVar185 = ZEXT1664(auVar72);
                          auVar179 = ZEXT3264(local_3c0);
                          auVar186 = ZEXT3264(local_340);
                          auVar188 = ZEXT3264(local_3e0);
                          auVar189 = ZEXT3264(local_360);
                          auVar187 = ZEXT3264(local_400);
                          auVar191 = ZEXT3264(local_380);
                          auVar190 = ZEXT3264(local_3a0);
                          auVar192 = ZEXT3264(local_420);
                          auVar72 = local_4c0;
                          break;
                        }
                      }
                      local_520->tfar = (float)local_440._0_4_;
                      bVar65 = false;
                      lVar62 = 0;
                      uVar63 = local_2a0._0_8_ ^ 1L << (local_280._0_8_ & 0x3f);
                      for (uVar61 = uVar63; (uVar61 & 1) == 0;
                          uVar61 = uVar61 >> 1 | 0x8000000000000000) {
                        lVar62 = lVar62 + 1;
                      }
                      auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar183 = ZEXT3264(auVar90);
                      auVar72 = vxorps_avx512vl(auVar184,auVar184);
                      auVar185 = ZEXT1664(auVar72);
                      auVar179 = ZEXT3264(local_3c0);
                      auVar186 = ZEXT3264(local_340);
                      auVar188 = ZEXT3264(local_3e0);
                      auVar189 = ZEXT3264(local_360);
                      auVar187 = ZEXT3264(local_400);
                      auVar191 = ZEXT3264(local_380);
                      auVar190 = ZEXT3264(local_3a0);
                      auVar192 = ZEXT3264(local_420);
                      auVar72 = local_4c0;
                    } while (uVar63 != 0);
                  }
                  goto LAB_01acf93a;
                }
              }
            }
            bVar65 = false;
            goto LAB_01acf93a;
          }
        }
        bVar65 = false;
      }
LAB_01acf93a:
      if (8 < iVar11) {
        local_280 = vpbroadcastd_avx512vl();
        local_2a0 = vbroadcastss_avx512vl(auVar72);
        auVar126._8_4_ = 3;
        auVar126._0_8_ = 0x300000003;
        auVar126._12_4_ = 3;
        auVar126._16_4_ = 3;
        auVar126._20_4_ = 3;
        auVar126._24_4_ = 3;
        auVar126._28_4_ = 3;
        local_2c0 = vpermps_avx2(auVar126,local_2c0);
        local_2e0._4_4_ = 1.0 / (float)local_2e0._0_4_;
        local_2e0._0_4_ = local_2e0._4_4_;
        fStack_2d8 = (float)local_2e0._4_4_;
        fStack_2d4 = (float)local_2e0._4_4_;
        fStack_2d0 = (float)local_2e0._4_4_;
        fStack_2cc = (float)local_2e0._4_4_;
        fStack_2c8 = (float)local_2e0._4_4_;
        fStack_2c4 = (float)local_2e0._4_4_;
        lVar62 = 8;
        do {
          auVar90 = vpbroadcastd_avx512vl();
          auVar76 = vpor_avx2(auVar90,_DAT_01fe9900);
          uVar24 = vpcmpd_avx512vl(auVar76,local_280,1);
          auVar90 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar62 * 4 + lVar25);
          auVar91 = *(undefined1 (*) [32])(lVar25 + 0x21b37f0 + lVar62 * 4);
          auVar89 = *(undefined1 (*) [32])(lVar25 + 0x21b3c74 + lVar62 * 4);
          auVar88 = *(undefined1 (*) [32])(lVar25 + 0x21b40f8 + lVar62 * 4);
          local_3a0 = auVar190._0_32_;
          auVar77 = vmulps_avx512vl(local_3a0,auVar88);
          auVar95 = auVar192._0_32_;
          auVar87 = vmulps_avx512vl(auVar95,auVar88);
          auVar38._4_4_ = auVar88._4_4_ * (float)local_e0._4_4_;
          auVar38._0_4_ = auVar88._0_4_ * (float)local_e0._0_4_;
          auVar38._8_4_ = auVar88._8_4_ * fStack_d8;
          auVar38._12_4_ = auVar88._12_4_ * fStack_d4;
          auVar38._16_4_ = auVar88._16_4_ * fStack_d0;
          auVar38._20_4_ = auVar88._20_4_ * fStack_cc;
          auVar38._24_4_ = auVar88._24_4_ * fStack_c8;
          auVar38._28_4_ = auVar76._28_4_;
          auVar93 = auVar187._0_32_;
          auVar76 = vfmadd231ps_avx512vl(auVar77,auVar89,auVar93);
          local_380 = auVar191._0_32_;
          auVar77 = vfmadd231ps_avx512vl(auVar87,auVar89,local_380);
          auVar87 = vfmadd231ps_avx512vl(auVar38,auVar89,local_c0);
          auVar94 = auVar188._0_32_;
          auVar76 = vfmadd231ps_avx512vl(auVar76,auVar91,auVar94);
          local_360 = auVar189._0_32_;
          auVar77 = vfmadd231ps_avx512vl(auVar77,auVar91,local_360);
          auVar72 = vfmadd231ps_fma(auVar87,auVar91,local_a0);
          auVar92 = auVar179._0_32_;
          auVar70 = vfmadd231ps_fma(auVar76,auVar90,auVar92);
          local_340 = auVar186._0_32_;
          auVar80 = vfmadd231ps_avx512vl(auVar77,auVar90,local_340);
          auVar76 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar62 * 4 + lVar25);
          auVar77 = *(undefined1 (*) [32])(lVar25 + 0x21b5c10 + lVar62 * 4);
          auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar90,local_80);
          auVar87 = *(undefined1 (*) [32])(lVar25 + 0x21b6094 + lVar62 * 4);
          auVar86 = *(undefined1 (*) [32])(lVar25 + 0x21b6518 + lVar62 * 4);
          auVar78 = vmulps_avx512vl(local_3a0,auVar86);
          auVar79 = vmulps_avx512vl(auVar95,auVar86);
          auVar39._4_4_ = auVar86._4_4_ * (float)local_e0._4_4_;
          auVar39._0_4_ = auVar86._0_4_ * (float)local_e0._0_4_;
          auVar39._8_4_ = auVar86._8_4_ * fStack_d8;
          auVar39._12_4_ = auVar86._12_4_ * fStack_d4;
          auVar39._16_4_ = auVar86._16_4_ * fStack_d0;
          auVar39._20_4_ = auVar86._20_4_ * fStack_cc;
          auVar39._24_4_ = auVar86._24_4_ * fStack_c8;
          auVar39._28_4_ = uStack_c4;
          auVar78 = vfmadd231ps_avx512vl(auVar78,auVar87,auVar93);
          auVar79 = vfmadd231ps_avx512vl(auVar79,auVar87,local_380);
          auVar81 = vfmadd231ps_avx512vl(auVar39,auVar87,local_c0);
          auVar78 = vfmadd231ps_avx512vl(auVar78,auVar77,auVar94);
          auVar79 = vfmadd231ps_avx512vl(auVar79,auVar77,local_360);
          auVar73 = vfmadd231ps_fma(auVar81,auVar77,local_a0);
          auVar81 = vfmadd231ps_avx512vl(auVar78,auVar76,auVar92);
          auVar82 = vfmadd231ps_avx512vl(auVar79,auVar76,local_340);
          auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar76,local_80);
          auVar83 = vmaxps_avx512vl(ZEXT1632(auVar72),ZEXT1632(auVar73));
          auVar78 = vsubps_avx(auVar81,ZEXT1632(auVar70));
          auVar79 = vsubps_avx(auVar82,auVar80);
          auVar84 = vmulps_avx512vl(auVar80,auVar78);
          auVar85 = vmulps_avx512vl(ZEXT1632(auVar70),auVar79);
          auVar84 = vsubps_avx512vl(auVar84,auVar85);
          auVar85 = vmulps_avx512vl(auVar79,auVar79);
          auVar85 = vfmadd231ps_avx512vl(auVar85,auVar78,auVar78);
          auVar83 = vmulps_avx512vl(auVar83,auVar83);
          auVar83 = vmulps_avx512vl(auVar83,auVar85);
          auVar84 = vmulps_avx512vl(auVar84,auVar84);
          uVar133 = vcmpps_avx512vl(auVar84,auVar83,2);
          bVar67 = (byte)uVar24 & (byte)uVar133;
          if (bVar67 == 0) {
            auVar179 = ZEXT3264(auVar92);
          }
          else {
            auVar86 = vmulps_avx512vl(local_120,auVar86);
            auVar87 = vfmadd213ps_avx512vl(auVar87,local_100,auVar86);
            auVar77 = vfmadd213ps_avx512vl(auVar77,local_320,auVar87);
            auVar76 = vfmadd213ps_avx512vl(auVar76,local_300,auVar77);
            auVar88 = vmulps_avx512vl(local_120,auVar88);
            auVar89 = vfmadd213ps_avx512vl(auVar89,local_100,auVar88);
            auVar91 = vfmadd213ps_avx512vl(auVar91,local_320,auVar89);
            auVar77 = vfmadd213ps_avx512vl(auVar90,local_300,auVar91);
            auVar90 = *(undefined1 (*) [32])(lVar25 + 0x21b457c + lVar62 * 4);
            auVar91 = *(undefined1 (*) [32])(lVar25 + 0x21b4a00 + lVar62 * 4);
            auVar89 = *(undefined1 (*) [32])(lVar25 + 0x21b4e84 + lVar62 * 4);
            auVar88 = *(undefined1 (*) [32])(lVar25 + 0x21b5308 + lVar62 * 4);
            auVar87 = vmulps_avx512vl(local_3a0,auVar88);
            auVar86 = vmulps_avx512vl(auVar95,auVar88);
            auVar88 = vmulps_avx512vl(local_120,auVar88);
            auVar87 = vfmadd231ps_avx512vl(auVar87,auVar89,auVar93);
            auVar86 = vfmadd231ps_avx512vl(auVar86,auVar89,local_380);
            auVar89 = vfmadd231ps_avx512vl(auVar88,local_100,auVar89);
            auVar88 = vfmadd231ps_avx512vl(auVar87,auVar91,auVar94);
            auVar87 = vfmadd231ps_avx512vl(auVar86,auVar91,local_360);
            auVar91 = vfmadd231ps_avx512vl(auVar89,local_320,auVar91);
            auVar88 = vfmadd231ps_avx512vl(auVar88,auVar90,auVar92);
            auVar87 = vfmadd231ps_avx512vl(auVar87,auVar90,local_340);
            auVar86 = vfmadd231ps_avx512vl(auVar91,local_300,auVar90);
            auVar90 = *(undefined1 (*) [32])(lVar25 + 0x21b699c + lVar62 * 4);
            auVar91 = *(undefined1 (*) [32])(lVar25 + 0x21b72a4 + lVar62 * 4);
            auVar89 = *(undefined1 (*) [32])(lVar25 + 0x21b7728 + lVar62 * 4);
            auVar83 = vmulps_avx512vl(local_3a0,auVar89);
            auVar84 = vmulps_avx512vl(auVar95,auVar89);
            auVar89 = vmulps_avx512vl(local_120,auVar89);
            auVar83 = vfmadd231ps_avx512vl(auVar83,auVar91,auVar93);
            auVar84 = vfmadd231ps_avx512vl(auVar84,auVar91,local_380);
            auVar89 = vfmadd231ps_avx512vl(auVar89,local_100,auVar91);
            auVar91 = *(undefined1 (*) [32])(lVar25 + 0x21b6e20 + lVar62 * 4);
            auVar83 = vfmadd231ps_avx512vl(auVar83,auVar91,auVar94);
            auVar84 = vfmadd231ps_avx512vl(auVar84,auVar91,local_360);
            auVar91 = vfmadd231ps_avx512vl(auVar89,local_320,auVar91);
            auVar89 = vfmadd231ps_avx512vl(auVar83,auVar90,auVar92);
            auVar83 = vfmadd231ps_avx512vl(auVar84,auVar90,local_340);
            auVar91 = vfmadd231ps_avx512vl(auVar91,local_300,auVar90);
            auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar88,auVar84);
            vandps_avx512vl(auVar87,auVar84);
            auVar90 = vmaxps_avx(auVar84,auVar84);
            vandps_avx512vl(auVar86,auVar84);
            auVar90 = vmaxps_avx(auVar90,auVar84);
            uVar61 = vcmpps_avx512vl(auVar90,local_2a0,1);
            bVar14 = (bool)((byte)uVar61 & 1);
            auVar106._0_4_ = (float)((uint)bVar14 * auVar78._0_4_ | (uint)!bVar14 * auVar88._0_4_);
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar106._4_4_ = (float)((uint)bVar14 * auVar78._4_4_ | (uint)!bVar14 * auVar88._4_4_);
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar106._8_4_ = (float)((uint)bVar14 * auVar78._8_4_ | (uint)!bVar14 * auVar88._8_4_);
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar106._12_4_ =
                 (float)((uint)bVar14 * auVar78._12_4_ | (uint)!bVar14 * auVar88._12_4_);
            bVar14 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar106._16_4_ =
                 (float)((uint)bVar14 * auVar78._16_4_ | (uint)!bVar14 * auVar88._16_4_);
            bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar106._20_4_ =
                 (float)((uint)bVar14 * auVar78._20_4_ | (uint)!bVar14 * auVar88._20_4_);
            bVar14 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar106._24_4_ =
                 (float)((uint)bVar14 * auVar78._24_4_ | (uint)!bVar14 * auVar88._24_4_);
            bVar14 = SUB81(uVar61 >> 7,0);
            auVar106._28_4_ = (uint)bVar14 * auVar78._28_4_ | (uint)!bVar14 * auVar88._28_4_;
            bVar14 = (bool)((byte)uVar61 & 1);
            auVar107._0_4_ = (float)((uint)bVar14 * auVar79._0_4_ | (uint)!bVar14 * auVar87._0_4_);
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar107._4_4_ = (float)((uint)bVar14 * auVar79._4_4_ | (uint)!bVar14 * auVar87._4_4_);
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar107._8_4_ = (float)((uint)bVar14 * auVar79._8_4_ | (uint)!bVar14 * auVar87._8_4_);
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar107._12_4_ =
                 (float)((uint)bVar14 * auVar79._12_4_ | (uint)!bVar14 * auVar87._12_4_);
            bVar14 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar107._16_4_ =
                 (float)((uint)bVar14 * auVar79._16_4_ | (uint)!bVar14 * auVar87._16_4_);
            bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar107._20_4_ =
                 (float)((uint)bVar14 * auVar79._20_4_ | (uint)!bVar14 * auVar87._20_4_);
            bVar14 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar107._24_4_ =
                 (float)((uint)bVar14 * auVar79._24_4_ | (uint)!bVar14 * auVar87._24_4_);
            bVar14 = SUB81(uVar61 >> 7,0);
            auVar107._28_4_ = (uint)bVar14 * auVar79._28_4_ | (uint)!bVar14 * auVar87._28_4_;
            vandps_avx512vl(auVar89,auVar84);
            vandps_avx512vl(auVar83,auVar84);
            auVar90 = vmaxps_avx(auVar107,auVar107);
            vandps_avx512vl(auVar91,auVar84);
            auVar90 = vmaxps_avx(auVar90,auVar107);
            uVar61 = vcmpps_avx512vl(auVar90,local_2a0,1);
            bVar14 = (bool)((byte)uVar61 & 1);
            auVar108._0_4_ = (uint)bVar14 * auVar78._0_4_ | (uint)!bVar14 * auVar89._0_4_;
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar108._4_4_ = (uint)bVar14 * auVar78._4_4_ | (uint)!bVar14 * auVar89._4_4_;
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar108._8_4_ = (uint)bVar14 * auVar78._8_4_ | (uint)!bVar14 * auVar89._8_4_;
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar108._12_4_ = (uint)bVar14 * auVar78._12_4_ | (uint)!bVar14 * auVar89._12_4_;
            bVar14 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar108._16_4_ = (uint)bVar14 * auVar78._16_4_ | (uint)!bVar14 * auVar89._16_4_;
            bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar108._20_4_ = (uint)bVar14 * auVar78._20_4_ | (uint)!bVar14 * auVar89._20_4_;
            bVar14 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar108._24_4_ = (uint)bVar14 * auVar78._24_4_ | (uint)!bVar14 * auVar89._24_4_;
            bVar14 = SUB81(uVar61 >> 7,0);
            auVar108._28_4_ = (uint)bVar14 * auVar78._28_4_ | (uint)!bVar14 * auVar89._28_4_;
            bVar14 = (bool)((byte)uVar61 & 1);
            auVar109._0_4_ = (float)((uint)bVar14 * auVar79._0_4_ | (uint)!bVar14 * auVar83._0_4_);
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar109._4_4_ = (float)((uint)bVar14 * auVar79._4_4_ | (uint)!bVar14 * auVar83._4_4_);
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar109._8_4_ = (float)((uint)bVar14 * auVar79._8_4_ | (uint)!bVar14 * auVar83._8_4_);
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar109._12_4_ =
                 (float)((uint)bVar14 * auVar79._12_4_ | (uint)!bVar14 * auVar83._12_4_);
            bVar14 = (bool)((byte)(uVar61 >> 4) & 1);
            auVar109._16_4_ =
                 (float)((uint)bVar14 * auVar79._16_4_ | (uint)!bVar14 * auVar83._16_4_);
            bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
            auVar109._20_4_ =
                 (float)((uint)bVar14 * auVar79._20_4_ | (uint)!bVar14 * auVar83._20_4_);
            bVar14 = (bool)((byte)(uVar61 >> 6) & 1);
            auVar109._24_4_ =
                 (float)((uint)bVar14 * auVar79._24_4_ | (uint)!bVar14 * auVar83._24_4_);
            bVar14 = SUB81(uVar61 >> 7,0);
            auVar109._28_4_ = (uint)bVar14 * auVar79._28_4_ | (uint)!bVar14 * auVar83._28_4_;
            auVar174._8_4_ = 0x80000000;
            auVar174._0_8_ = 0x8000000080000000;
            auVar174._12_4_ = 0x80000000;
            auVar174._16_4_ = 0x80000000;
            auVar174._20_4_ = 0x80000000;
            auVar174._24_4_ = 0x80000000;
            auVar174._28_4_ = 0x80000000;
            auVar90 = vxorps_avx512vl(auVar108,auVar174);
            auVar85 = auVar185._0_32_;
            auVar91 = vfmadd213ps_avx512vl(auVar106,auVar106,auVar85);
            auVar20 = vfmadd231ps_fma(auVar91,auVar107,auVar107);
            auVar91 = vrsqrt14ps_avx512vl(ZEXT1632(auVar20));
            auVar182._8_4_ = 0xbf000000;
            auVar182._0_8_ = 0xbf000000bf000000;
            auVar182._12_4_ = 0xbf000000;
            auVar182._16_4_ = 0xbf000000;
            auVar182._20_4_ = 0xbf000000;
            auVar182._24_4_ = 0xbf000000;
            auVar182._28_4_ = 0xbf000000;
            fVar158 = auVar91._0_4_;
            fVar132 = auVar91._4_4_;
            fVar139 = auVar91._8_4_;
            fVar140 = auVar91._12_4_;
            fVar141 = auVar91._16_4_;
            fVar164 = auVar91._20_4_;
            fVar165 = auVar91._24_4_;
            auVar40._4_4_ = fVar132 * fVar132 * fVar132 * auVar20._4_4_ * -0.5;
            auVar40._0_4_ = fVar158 * fVar158 * fVar158 * auVar20._0_4_ * -0.5;
            auVar40._8_4_ = fVar139 * fVar139 * fVar139 * auVar20._8_4_ * -0.5;
            auVar40._12_4_ = fVar140 * fVar140 * fVar140 * auVar20._12_4_ * -0.5;
            auVar40._16_4_ = fVar141 * fVar141 * fVar141 * -0.0;
            auVar40._20_4_ = fVar164 * fVar164 * fVar164 * -0.0;
            auVar40._24_4_ = fVar165 * fVar165 * fVar165 * -0.0;
            auVar40._28_4_ = auVar107._28_4_;
            auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar91 = vfmadd231ps_avx512vl(auVar40,auVar89,auVar91);
            auVar41._4_4_ = auVar107._4_4_ * auVar91._4_4_;
            auVar41._0_4_ = auVar107._0_4_ * auVar91._0_4_;
            auVar41._8_4_ = auVar107._8_4_ * auVar91._8_4_;
            auVar41._12_4_ = auVar107._12_4_ * auVar91._12_4_;
            auVar41._16_4_ = auVar107._16_4_ * auVar91._16_4_;
            auVar41._20_4_ = auVar107._20_4_ * auVar91._20_4_;
            auVar41._24_4_ = auVar107._24_4_ * auVar91._24_4_;
            auVar41._28_4_ = 0;
            auVar42._4_4_ = auVar91._4_4_ * -auVar106._4_4_;
            auVar42._0_4_ = auVar91._0_4_ * -auVar106._0_4_;
            auVar42._8_4_ = auVar91._8_4_ * -auVar106._8_4_;
            auVar42._12_4_ = auVar91._12_4_ * -auVar106._12_4_;
            auVar42._16_4_ = auVar91._16_4_ * -auVar106._16_4_;
            auVar42._20_4_ = auVar91._20_4_ * -auVar106._20_4_;
            auVar42._24_4_ = auVar91._24_4_ * -auVar106._24_4_;
            auVar42._28_4_ = auVar107._28_4_;
            auVar88 = vmulps_avx512vl(auVar91,auVar85);
            auVar91 = vfmadd213ps_avx512vl(auVar108,auVar108,auVar85);
            auVar91 = vfmadd231ps_avx512vl(auVar91,auVar109,auVar109);
            auVar87 = vrsqrt14ps_avx512vl(auVar91);
            auVar91 = vmulps_avx512vl(auVar91,auVar182);
            fVar158 = auVar87._0_4_;
            fVar132 = auVar87._4_4_;
            fVar139 = auVar87._8_4_;
            fVar140 = auVar87._12_4_;
            fVar141 = auVar87._16_4_;
            fVar164 = auVar87._20_4_;
            fVar165 = auVar87._24_4_;
            auVar43._4_4_ = fVar132 * fVar132 * fVar132 * auVar91._4_4_;
            auVar43._0_4_ = fVar158 * fVar158 * fVar158 * auVar91._0_4_;
            auVar43._8_4_ = fVar139 * fVar139 * fVar139 * auVar91._8_4_;
            auVar43._12_4_ = fVar140 * fVar140 * fVar140 * auVar91._12_4_;
            auVar43._16_4_ = fVar141 * fVar141 * fVar141 * auVar91._16_4_;
            auVar43._20_4_ = fVar164 * fVar164 * fVar164 * auVar91._20_4_;
            auVar43._24_4_ = fVar165 * fVar165 * fVar165 * auVar91._24_4_;
            auVar43._28_4_ = auVar91._28_4_;
            auVar91 = vfmadd231ps_avx512vl(auVar43,auVar89,auVar87);
            auVar44._4_4_ = auVar109._4_4_ * auVar91._4_4_;
            auVar44._0_4_ = auVar109._0_4_ * auVar91._0_4_;
            auVar44._8_4_ = auVar109._8_4_ * auVar91._8_4_;
            auVar44._12_4_ = auVar109._12_4_ * auVar91._12_4_;
            auVar44._16_4_ = auVar109._16_4_ * auVar91._16_4_;
            auVar44._20_4_ = auVar109._20_4_ * auVar91._20_4_;
            auVar44._24_4_ = auVar109._24_4_ * auVar91._24_4_;
            auVar44._28_4_ = auVar87._28_4_;
            auVar45._4_4_ = auVar91._4_4_ * auVar90._4_4_;
            auVar45._0_4_ = auVar91._0_4_ * auVar90._0_4_;
            auVar45._8_4_ = auVar91._8_4_ * auVar90._8_4_;
            auVar45._12_4_ = auVar91._12_4_ * auVar90._12_4_;
            auVar45._16_4_ = auVar91._16_4_ * auVar90._16_4_;
            auVar45._20_4_ = auVar91._20_4_ * auVar90._20_4_;
            auVar45._24_4_ = auVar91._24_4_ * auVar90._24_4_;
            auVar45._28_4_ = auVar90._28_4_;
            auVar90 = vmulps_avx512vl(auVar91,auVar85);
            auVar20 = vfmadd213ps_fma(auVar41,ZEXT1632(auVar72),ZEXT1632(auVar70));
            auVar91 = ZEXT1632(auVar72);
            auVar184 = vfmadd213ps_fma(auVar42,auVar91,auVar80);
            auVar89 = vfmadd213ps_avx512vl(auVar88,auVar91,auVar77);
            auVar87 = vfmadd213ps_avx512vl(auVar44,ZEXT1632(auVar73),auVar81);
            auVar74 = vfnmadd213ps_fma(auVar41,auVar91,ZEXT1632(auVar70));
            auVar86 = ZEXT1632(auVar73);
            auVar70 = vfmadd213ps_fma(auVar45,auVar86,auVar82);
            auVar75 = vfnmadd213ps_fma(auVar42,auVar91,auVar80);
            auVar21 = vfmadd213ps_fma(auVar90,auVar86,auVar76);
            auVar83 = ZEXT1632(auVar72);
            auVar68 = vfnmadd231ps_fma(auVar77,auVar83,auVar88);
            auVar71 = vfnmadd213ps_fma(auVar44,auVar86,auVar81);
            auVar69 = vfnmadd213ps_fma(auVar45,auVar86,auVar82);
            auVar123 = vfnmadd231ps_fma(auVar76,ZEXT1632(auVar73),auVar90);
            auVar76 = vsubps_avx512vl(auVar87,ZEXT1632(auVar74));
            auVar90 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar75));
            auVar91 = vsubps_avx(ZEXT1632(auVar21),ZEXT1632(auVar68));
            auVar46._4_4_ = auVar90._4_4_ * auVar68._4_4_;
            auVar46._0_4_ = auVar90._0_4_ * auVar68._0_4_;
            auVar46._8_4_ = auVar90._8_4_ * auVar68._8_4_;
            auVar46._12_4_ = auVar90._12_4_ * auVar68._12_4_;
            auVar46._16_4_ = auVar90._16_4_ * 0.0;
            auVar46._20_4_ = auVar90._20_4_ * 0.0;
            auVar46._24_4_ = auVar90._24_4_ * 0.0;
            auVar46._28_4_ = auVar88._28_4_;
            auVar72 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar75),auVar91);
            auVar47._4_4_ = auVar91._4_4_ * auVar74._4_4_;
            auVar47._0_4_ = auVar91._0_4_ * auVar74._0_4_;
            auVar47._8_4_ = auVar91._8_4_ * auVar74._8_4_;
            auVar47._12_4_ = auVar91._12_4_ * auVar74._12_4_;
            auVar47._16_4_ = auVar91._16_4_ * 0.0;
            auVar47._20_4_ = auVar91._20_4_ * 0.0;
            auVar47._24_4_ = auVar91._24_4_ * 0.0;
            auVar47._28_4_ = auVar91._28_4_;
            auVar22 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar68),auVar76);
            auVar48._4_4_ = auVar75._4_4_ * auVar76._4_4_;
            auVar48._0_4_ = auVar75._0_4_ * auVar76._0_4_;
            auVar48._8_4_ = auVar75._8_4_ * auVar76._8_4_;
            auVar48._12_4_ = auVar75._12_4_ * auVar76._12_4_;
            auVar48._16_4_ = auVar76._16_4_ * 0.0;
            auVar48._20_4_ = auVar76._20_4_ * 0.0;
            auVar48._24_4_ = auVar76._24_4_ * 0.0;
            auVar48._28_4_ = auVar76._28_4_;
            auVar23 = vfmsub231ps_fma(auVar48,ZEXT1632(auVar74),auVar90);
            auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar23),auVar85,ZEXT1632(auVar22));
            auVar90 = vfmadd231ps_avx512vl(auVar90,auVar85,ZEXT1632(auVar72));
            uVar61 = vcmpps_avx512vl(auVar90,auVar85,2);
            bVar59 = (byte)uVar61;
            fVar168 = (float)((uint)(bVar59 & 1) * auVar20._0_4_ |
                             (uint)!(bool)(bVar59 & 1) * auVar71._0_4_);
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            fVar116 = (float)((uint)bVar14 * auVar20._4_4_ | (uint)!bVar14 * auVar71._4_4_);
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            fVar118 = (float)((uint)bVar14 * auVar20._8_4_ | (uint)!bVar14 * auVar71._8_4_);
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            fVar120 = (float)((uint)bVar14 * auVar20._12_4_ | (uint)!bVar14 * auVar71._12_4_);
            auVar86 = ZEXT1632(CONCAT412(fVar120,CONCAT48(fVar118,CONCAT44(fVar116,fVar168))));
            fVar169 = (float)((uint)(bVar59 & 1) * auVar184._0_4_ |
                             (uint)!(bool)(bVar59 & 1) * auVar69._0_4_);
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            fVar117 = (float)((uint)bVar14 * auVar184._4_4_ | (uint)!bVar14 * auVar69._4_4_);
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            fVar119 = (float)((uint)bVar14 * auVar184._8_4_ | (uint)!bVar14 * auVar69._8_4_);
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            fVar121 = (float)((uint)bVar14 * auVar184._12_4_ | (uint)!bVar14 * auVar69._12_4_);
            auVar78 = ZEXT1632(CONCAT412(fVar121,CONCAT48(fVar119,CONCAT44(fVar117,fVar169))));
            auVar110._0_4_ =
                 (float)((uint)(bVar59 & 1) * auVar89._0_4_ |
                        (uint)!(bool)(bVar59 & 1) * auVar123._0_4_);
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar110._4_4_ = (float)((uint)bVar14 * auVar89._4_4_ | (uint)!bVar14 * auVar123._4_4_);
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar110._8_4_ = (float)((uint)bVar14 * auVar89._8_4_ | (uint)!bVar14 * auVar123._8_4_);
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar110._12_4_ =
                 (float)((uint)bVar14 * auVar89._12_4_ | (uint)!bVar14 * auVar123._12_4_);
            fVar139 = (float)((uint)((byte)(uVar61 >> 4) & 1) * auVar89._16_4_);
            auVar110._16_4_ = fVar139;
            fVar132 = (float)((uint)((byte)(uVar61 >> 5) & 1) * auVar89._20_4_);
            auVar110._20_4_ = fVar132;
            fVar158 = (float)((uint)((byte)(uVar61 >> 6) & 1) * auVar89._24_4_);
            auVar110._24_4_ = fVar158;
            iVar1 = (uint)(byte)(uVar61 >> 7) * auVar89._28_4_;
            auVar110._28_4_ = iVar1;
            auVar90 = vblendmps_avx512vl(ZEXT1632(auVar74),auVar87);
            auVar111._0_4_ =
                 (uint)(bVar59 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar72._0_4_;
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar111._4_4_ = (uint)bVar14 * auVar90._4_4_ | (uint)!bVar14 * auVar72._4_4_;
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar111._8_4_ = (uint)bVar14 * auVar90._8_4_ | (uint)!bVar14 * auVar72._8_4_;
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar111._12_4_ = (uint)bVar14 * auVar90._12_4_ | (uint)!bVar14 * auVar72._12_4_;
            auVar111._16_4_ = (uint)((byte)(uVar61 >> 4) & 1) * auVar90._16_4_;
            auVar111._20_4_ = (uint)((byte)(uVar61 >> 5) & 1) * auVar90._20_4_;
            auVar111._24_4_ = (uint)((byte)(uVar61 >> 6) & 1) * auVar90._24_4_;
            auVar111._28_4_ = (uint)(byte)(uVar61 >> 7) * auVar90._28_4_;
            auVar90 = vblendmps_avx512vl(ZEXT1632(auVar75),ZEXT1632(auVar70));
            auVar112._0_4_ =
                 (float)((uint)(bVar59 & 1) * auVar90._0_4_ |
                        (uint)!(bool)(bVar59 & 1) * auVar20._0_4_);
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar112._4_4_ = (float)((uint)bVar14 * auVar90._4_4_ | (uint)!bVar14 * auVar20._4_4_);
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar112._8_4_ = (float)((uint)bVar14 * auVar90._8_4_ | (uint)!bVar14 * auVar20._8_4_);
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar112._12_4_ =
                 (float)((uint)bVar14 * auVar90._12_4_ | (uint)!bVar14 * auVar20._12_4_);
            fVar140 = (float)((uint)((byte)(uVar61 >> 4) & 1) * auVar90._16_4_);
            auVar112._16_4_ = fVar140;
            fVar141 = (float)((uint)((byte)(uVar61 >> 5) & 1) * auVar90._20_4_);
            auVar112._20_4_ = fVar141;
            fVar164 = (float)((uint)((byte)(uVar61 >> 6) & 1) * auVar90._24_4_);
            auVar112._24_4_ = fVar164;
            auVar112._28_4_ = (uint)(byte)(uVar61 >> 7) * auVar90._28_4_;
            auVar90 = vblendmps_avx512vl(ZEXT1632(auVar68),ZEXT1632(auVar21));
            auVar113._0_4_ =
                 (float)((uint)(bVar59 & 1) * auVar90._0_4_ |
                        (uint)!(bool)(bVar59 & 1) * auVar184._0_4_);
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar113._4_4_ = (float)((uint)bVar14 * auVar90._4_4_ | (uint)!bVar14 * auVar184._4_4_);
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar113._8_4_ = (float)((uint)bVar14 * auVar90._8_4_ | (uint)!bVar14 * auVar184._8_4_);
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar113._12_4_ =
                 (float)((uint)bVar14 * auVar90._12_4_ | (uint)!bVar14 * auVar184._12_4_);
            fVar166 = (float)((uint)((byte)(uVar61 >> 4) & 1) * auVar90._16_4_);
            auVar113._16_4_ = fVar166;
            fVar165 = (float)((uint)((byte)(uVar61 >> 5) & 1) * auVar90._20_4_);
            auVar113._20_4_ = fVar165;
            fVar167 = (float)((uint)((byte)(uVar61 >> 6) & 1) * auVar90._24_4_);
            auVar113._24_4_ = fVar167;
            iVar2 = (uint)(byte)(uVar61 >> 7) * auVar90._28_4_;
            auVar113._28_4_ = iVar2;
            auVar114._0_4_ =
                 (uint)(bVar59 & 1) * (int)auVar74._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar87._0_4_
            ;
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            auVar114._4_4_ = (uint)bVar14 * (int)auVar74._4_4_ | (uint)!bVar14 * auVar87._4_4_;
            bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
            auVar114._8_4_ = (uint)bVar14 * (int)auVar74._8_4_ | (uint)!bVar14 * auVar87._8_4_;
            bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar114._12_4_ = (uint)bVar14 * (int)auVar74._12_4_ | (uint)!bVar14 * auVar87._12_4_;
            auVar114._16_4_ = (uint)!(bool)((byte)(uVar61 >> 4) & 1) * auVar87._16_4_;
            auVar114._20_4_ = (uint)!(bool)((byte)(uVar61 >> 5) & 1) * auVar87._20_4_;
            auVar114._24_4_ = (uint)!(bool)((byte)(uVar61 >> 6) & 1) * auVar87._24_4_;
            auVar114._28_4_ = (uint)!SUB81(uVar61 >> 7,0) * auVar87._28_4_;
            bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar61 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar61 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar61 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar61 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar61 >> 3) & 1);
            auVar87 = vsubps_avx512vl(auVar114,auVar86);
            auVar91 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar75._12_4_ |
                                                    (uint)!bVar18 * auVar70._12_4_,
                                                    CONCAT48((uint)bVar16 * (int)auVar75._8_4_ |
                                                             (uint)!bVar16 * auVar70._8_4_,
                                                             CONCAT44((uint)bVar14 *
                                                                      (int)auVar75._4_4_ |
                                                                      (uint)!bVar14 * auVar70._4_4_,
                                                                      (uint)(bVar59 & 1) *
                                                                      (int)auVar75._0_4_ |
                                                                      (uint)!(bool)(bVar59 & 1) *
                                                                      auVar70._0_4_)))),auVar78);
            auVar89 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar68._12_4_ |
                                                    (uint)!bVar19 * auVar21._12_4_,
                                                    CONCAT48((uint)bVar17 * (int)auVar68._8_4_ |
                                                             (uint)!bVar17 * auVar21._8_4_,
                                                             CONCAT44((uint)bVar15 *
                                                                      (int)auVar68._4_4_ |
                                                                      (uint)!bVar15 * auVar21._4_4_,
                                                                      (uint)(bVar59 & 1) *
                                                                      (int)auVar68._0_4_ |
                                                                      (uint)!(bool)(bVar59 & 1) *
                                                                      auVar21._0_4_)))),auVar110);
            auVar88 = vsubps_avx(auVar86,auVar111);
            auVar76 = vsubps_avx(auVar78,auVar112);
            auVar77 = vsubps_avx(auVar110,auVar113);
            auVar49._4_4_ = auVar89._4_4_ * fVar116;
            auVar49._0_4_ = auVar89._0_4_ * fVar168;
            auVar49._8_4_ = auVar89._8_4_ * fVar118;
            auVar49._12_4_ = auVar89._12_4_ * fVar120;
            auVar49._16_4_ = auVar89._16_4_ * 0.0;
            auVar49._20_4_ = auVar89._20_4_ * 0.0;
            auVar49._24_4_ = auVar89._24_4_ * 0.0;
            auVar49._28_4_ = 0;
            auVar72 = vfmsub231ps_fma(auVar49,auVar110,auVar87);
            auVar148._0_4_ = fVar169 * auVar87._0_4_;
            auVar148._4_4_ = fVar117 * auVar87._4_4_;
            auVar148._8_4_ = fVar119 * auVar87._8_4_;
            auVar148._12_4_ = fVar121 * auVar87._12_4_;
            auVar148._16_4_ = auVar87._16_4_ * 0.0;
            auVar148._20_4_ = auVar87._20_4_ * 0.0;
            auVar148._24_4_ = auVar87._24_4_ * 0.0;
            auVar148._28_4_ = 0;
            auVar70 = vfmsub231ps_fma(auVar148,auVar86,auVar91);
            auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar70),auVar85,ZEXT1632(auVar72));
            auVar153._0_4_ = auVar91._0_4_ * auVar110._0_4_;
            auVar153._4_4_ = auVar91._4_4_ * auVar110._4_4_;
            auVar153._8_4_ = auVar91._8_4_ * auVar110._8_4_;
            auVar153._12_4_ = auVar91._12_4_ * auVar110._12_4_;
            auVar153._16_4_ = auVar91._16_4_ * fVar139;
            auVar153._20_4_ = auVar91._20_4_ * fVar132;
            auVar153._24_4_ = auVar91._24_4_ * fVar158;
            auVar153._28_4_ = 0;
            auVar72 = vfmsub231ps_fma(auVar153,auVar78,auVar89);
            auVar79 = vfmadd231ps_avx512vl(auVar90,auVar85,ZEXT1632(auVar72));
            auVar90 = vmulps_avx512vl(auVar77,auVar111);
            auVar90 = vfmsub231ps_avx512vl(auVar90,auVar88,auVar113);
            auVar50._4_4_ = auVar76._4_4_ * auVar113._4_4_;
            auVar50._0_4_ = auVar76._0_4_ * auVar113._0_4_;
            auVar50._8_4_ = auVar76._8_4_ * auVar113._8_4_;
            auVar50._12_4_ = auVar76._12_4_ * auVar113._12_4_;
            auVar50._16_4_ = auVar76._16_4_ * fVar166;
            auVar50._20_4_ = auVar76._20_4_ * fVar165;
            auVar50._24_4_ = auVar76._24_4_ * fVar167;
            auVar50._28_4_ = iVar2;
            auVar72 = vfmsub231ps_fma(auVar50,auVar112,auVar77);
            auVar154._0_4_ = auVar112._0_4_ * auVar88._0_4_;
            auVar154._4_4_ = auVar112._4_4_ * auVar88._4_4_;
            auVar154._8_4_ = auVar112._8_4_ * auVar88._8_4_;
            auVar154._12_4_ = auVar112._12_4_ * auVar88._12_4_;
            auVar154._16_4_ = fVar140 * auVar88._16_4_;
            auVar154._20_4_ = fVar141 * auVar88._20_4_;
            auVar154._24_4_ = fVar164 * auVar88._24_4_;
            auVar154._28_4_ = 0;
            auVar70 = vfmsub231ps_fma(auVar154,auVar76,auVar111);
            auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar70),auVar85,auVar90);
            auVar80 = vfmadd231ps_avx512vl(auVar90,auVar85,ZEXT1632(auVar72));
            auVar90 = vmaxps_avx(auVar79,auVar80);
            uVar133 = vcmpps_avx512vl(auVar90,auVar85,2);
            bVar67 = bVar67 & (byte)uVar133;
            if (bVar67 != 0) {
              auVar51._4_4_ = auVar77._4_4_ * auVar91._4_4_;
              auVar51._0_4_ = auVar77._0_4_ * auVar91._0_4_;
              auVar51._8_4_ = auVar77._8_4_ * auVar91._8_4_;
              auVar51._12_4_ = auVar77._12_4_ * auVar91._12_4_;
              auVar51._16_4_ = auVar77._16_4_ * auVar91._16_4_;
              auVar51._20_4_ = auVar77._20_4_ * auVar91._20_4_;
              auVar51._24_4_ = auVar77._24_4_ * auVar91._24_4_;
              auVar51._28_4_ = auVar90._28_4_;
              auVar20 = vfmsub231ps_fma(auVar51,auVar76,auVar89);
              auVar52._4_4_ = auVar89._4_4_ * auVar88._4_4_;
              auVar52._0_4_ = auVar89._0_4_ * auVar88._0_4_;
              auVar52._8_4_ = auVar89._8_4_ * auVar88._8_4_;
              auVar52._12_4_ = auVar89._12_4_ * auVar88._12_4_;
              auVar52._16_4_ = auVar89._16_4_ * auVar88._16_4_;
              auVar52._20_4_ = auVar89._20_4_ * auVar88._20_4_;
              auVar52._24_4_ = auVar89._24_4_ * auVar88._24_4_;
              auVar52._28_4_ = auVar89._28_4_;
              auVar70 = vfmsub231ps_fma(auVar52,auVar87,auVar77);
              auVar53._4_4_ = auVar76._4_4_ * auVar87._4_4_;
              auVar53._0_4_ = auVar76._0_4_ * auVar87._0_4_;
              auVar53._8_4_ = auVar76._8_4_ * auVar87._8_4_;
              auVar53._12_4_ = auVar76._12_4_ * auVar87._12_4_;
              auVar53._16_4_ = auVar76._16_4_ * auVar87._16_4_;
              auVar53._20_4_ = auVar76._20_4_ * auVar87._20_4_;
              auVar53._24_4_ = auVar76._24_4_ * auVar87._24_4_;
              auVar53._28_4_ = auVar76._28_4_;
              auVar184 = vfmsub231ps_fma(auVar53,auVar88,auVar91);
              auVar72 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar70),ZEXT1632(auVar184));
              auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar72),ZEXT1632(auVar20),auVar85);
              auVar91 = vrcp14ps_avx512vl(auVar90);
              auVar88 = auVar183._0_32_;
              auVar89 = vfnmadd213ps_avx512vl(auVar91,auVar90,auVar88);
              auVar72 = vfmadd132ps_fma(auVar89,auVar91,auVar91);
              auVar54._4_4_ = auVar184._4_4_ * auVar110._4_4_;
              auVar54._0_4_ = auVar184._0_4_ * auVar110._0_4_;
              auVar54._8_4_ = auVar184._8_4_ * auVar110._8_4_;
              auVar54._12_4_ = auVar184._12_4_ * auVar110._12_4_;
              auVar54._16_4_ = fVar139 * 0.0;
              auVar54._20_4_ = fVar132 * 0.0;
              auVar54._24_4_ = fVar158 * 0.0;
              auVar54._28_4_ = iVar1;
              auVar70 = vfmadd231ps_fma(auVar54,auVar78,ZEXT1632(auVar70));
              auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar86,ZEXT1632(auVar20));
              fVar132 = auVar72._0_4_;
              fVar139 = auVar72._4_4_;
              fVar140 = auVar72._8_4_;
              fVar141 = auVar72._12_4_;
              local_200 = ZEXT1632(CONCAT412(auVar70._12_4_ * fVar141,
                                             CONCAT48(auVar70._8_4_ * fVar140,
                                                      CONCAT44(auVar70._4_4_ * fVar139,
                                                               auVar70._0_4_ * fVar132))));
              uVar133 = vcmpps_avx512vl(local_200,local_2c0,0xd);
              fVar158 = local_520->tfar;
              auVar29._4_4_ = fVar158;
              auVar29._0_4_ = fVar158;
              auVar29._8_4_ = fVar158;
              auVar29._12_4_ = fVar158;
              auVar29._16_4_ = fVar158;
              auVar29._20_4_ = fVar158;
              auVar29._24_4_ = fVar158;
              auVar29._28_4_ = fVar158;
              uVar24 = vcmpps_avx512vl(local_200,auVar29,2);
              bVar67 = (byte)uVar133 & (byte)uVar24 & bVar67;
              if (bVar67 != 0) {
                uVar133 = vcmpps_avx512vl(auVar90,auVar85,4);
                bVar67 = bVar67 & (byte)uVar133;
                auVar179 = ZEXT3264(auVar92);
                if (bVar67 != 0) {
                  fVar158 = auVar79._0_4_ * fVar132;
                  fVar164 = auVar79._4_4_ * fVar139;
                  auVar55._4_4_ = fVar164;
                  auVar55._0_4_ = fVar158;
                  fVar165 = auVar79._8_4_ * fVar140;
                  auVar55._8_4_ = fVar165;
                  fVar166 = auVar79._12_4_ * fVar141;
                  auVar55._12_4_ = fVar166;
                  fVar167 = auVar79._16_4_ * 0.0;
                  auVar55._16_4_ = fVar167;
                  fVar168 = auVar79._20_4_ * 0.0;
                  auVar55._20_4_ = fVar168;
                  fVar169 = auVar79._24_4_ * 0.0;
                  auVar55._24_4_ = fVar169;
                  auVar55._28_4_ = auVar90._28_4_;
                  auVar91 = vsubps_avx512vl(auVar88,auVar55);
                  local_240._0_4_ =
                       (float)((uint)(bVar59 & 1) * (int)fVar158 |
                              (uint)!(bool)(bVar59 & 1) * auVar91._0_4_);
                  bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
                  local_240._4_4_ =
                       (float)((uint)bVar14 * (int)fVar164 | (uint)!bVar14 * auVar91._4_4_);
                  bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
                  local_240._8_4_ =
                       (float)((uint)bVar14 * (int)fVar165 | (uint)!bVar14 * auVar91._8_4_);
                  bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
                  local_240._12_4_ =
                       (float)((uint)bVar14 * (int)fVar166 | (uint)!bVar14 * auVar91._12_4_);
                  bVar14 = (bool)((byte)(uVar61 >> 4) & 1);
                  local_240._16_4_ =
                       (float)((uint)bVar14 * (int)fVar167 | (uint)!bVar14 * auVar91._16_4_);
                  bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
                  local_240._20_4_ =
                       (float)((uint)bVar14 * (int)fVar168 | (uint)!bVar14 * auVar91._20_4_);
                  bVar14 = (bool)((byte)(uVar61 >> 6) & 1);
                  local_240._24_4_ =
                       (float)((uint)bVar14 * (int)fVar169 | (uint)!bVar14 * auVar91._24_4_);
                  bVar14 = SUB81(uVar61 >> 7,0);
                  local_240._28_4_ =
                       (float)((uint)bVar14 * auVar90._28_4_ | (uint)!bVar14 * auVar91._28_4_);
                  auVar90 = vsubps_avx(ZEXT1632(auVar73),auVar83);
                  auVar72 = vfmadd213ps_fma(auVar90,local_240,auVar83);
                  fVar158 = local_508->depth_scale;
                  auVar30._4_4_ = fVar158;
                  auVar30._0_4_ = fVar158;
                  auVar30._8_4_ = fVar158;
                  auVar30._12_4_ = fVar158;
                  auVar30._16_4_ = fVar158;
                  auVar30._20_4_ = fVar158;
                  auVar30._24_4_ = fVar158;
                  auVar30._28_4_ = fVar158;
                  auVar90 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar72._12_4_ + auVar72._12_4_,
                                                               CONCAT48(auVar72._8_4_ +
                                                                        auVar72._8_4_,
                                                                        CONCAT44(auVar72._4_4_ +
                                                                                 auVar72._4_4_,
                                                                                 auVar72._0_4_ +
                                                                                 auVar72._0_4_)))),
                                            auVar30);
                  uVar133 = vcmpps_avx512vl(local_200,auVar90,6);
                  if (((byte)uVar133 & bVar67) != 0) {
                    auVar9._0_4_ = local_520->tfar;
                    auVar9._4_4_ = local_520->mask;
                    auVar9._8_4_ = local_520->id;
                    auVar9._12_4_ = local_520->flags;
                    uVar60 = vextractps_avx(auVar9,1);
                    auVar131._0_4_ = auVar80._0_4_ * fVar132;
                    auVar131._4_4_ = auVar80._4_4_ * fVar139;
                    auVar131._8_4_ = auVar80._8_4_ * fVar140;
                    auVar131._12_4_ = auVar80._12_4_ * fVar141;
                    auVar131._16_4_ = auVar80._16_4_ * 0.0;
                    auVar131._20_4_ = auVar80._20_4_ * 0.0;
                    auVar131._24_4_ = auVar80._24_4_ * 0.0;
                    auVar131._28_4_ = 0;
                    auVar90 = vsubps_avx512vl(auVar88,auVar131);
                    auVar115._0_4_ =
                         (uint)(bVar59 & 1) * (int)auVar131._0_4_ |
                         (uint)!(bool)(bVar59 & 1) * auVar90._0_4_;
                    bVar14 = (bool)((byte)(uVar61 >> 1) & 1);
                    auVar115._4_4_ =
                         (uint)bVar14 * (int)auVar131._4_4_ | (uint)!bVar14 * auVar90._4_4_;
                    bVar14 = (bool)((byte)(uVar61 >> 2) & 1);
                    auVar115._8_4_ =
                         (uint)bVar14 * (int)auVar131._8_4_ | (uint)!bVar14 * auVar90._8_4_;
                    bVar14 = (bool)((byte)(uVar61 >> 3) & 1);
                    auVar115._12_4_ =
                         (uint)bVar14 * (int)auVar131._12_4_ | (uint)!bVar14 * auVar90._12_4_;
                    bVar14 = (bool)((byte)(uVar61 >> 4) & 1);
                    auVar115._16_4_ =
                         (uint)bVar14 * (int)auVar131._16_4_ | (uint)!bVar14 * auVar90._16_4_;
                    bVar14 = (bool)((byte)(uVar61 >> 5) & 1);
                    auVar115._20_4_ =
                         (uint)bVar14 * (int)auVar131._20_4_ | (uint)!bVar14 * auVar90._20_4_;
                    bVar14 = (bool)((byte)(uVar61 >> 6) & 1);
                    auVar115._24_4_ =
                         (uint)bVar14 * (int)auVar131._24_4_ | (uint)!bVar14 * auVar90._24_4_;
                    auVar115._28_4_ = (uint)!SUB81(uVar61 >> 7,0) * auVar90._28_4_;
                    auVar31._8_4_ = 0x40000000;
                    auVar31._0_8_ = 0x4000000040000000;
                    auVar31._12_4_ = 0x40000000;
                    auVar31._16_4_ = 0x40000000;
                    auVar31._20_4_ = 0x40000000;
                    auVar31._24_4_ = 0x40000000;
                    auVar31._28_4_ = 0x40000000;
                    local_220 = vfmsub132ps_avx512vl(auVar115,auVar88,auVar31);
                    local_1e0 = (int)lVar62;
                    local_1dc = iVar11;
                    local_1d0 = local_450;
                    local_1c0 = local_460;
                    local_1b0 = local_500;
                    uStack_1a8 = uStack_4f8;
                    pGVar12 = (context->scene->geometries).items[local_510].ptr;
                    if ((pGVar12->mask & uVar60) == 0) {
                      bVar59 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar59 = 1, pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar72 = vcvtsi2ss_avx512f(auVar84._0_16_,(int)lVar62);
                      fVar158 = auVar72._0_4_;
                      local_180[0] = (fVar158 + local_240._0_4_ + 0.0) * (float)local_2e0._0_4_;
                      local_180[1] = (fVar158 + local_240._4_4_ + 1.0) * (float)local_2e0._4_4_;
                      local_180[2] = (fVar158 + local_240._8_4_ + 2.0) * fStack_2d8;
                      local_180[3] = (fVar158 + local_240._12_4_ + 3.0) * fStack_2d4;
                      fStack_170 = (fVar158 + local_240._16_4_ + 4.0) * fStack_2d0;
                      fStack_16c = (fVar158 + local_240._20_4_ + 5.0) * fStack_2cc;
                      fStack_168 = (fVar158 + local_240._24_4_ + 6.0) * fStack_2c8;
                      fStack_164 = fVar158 + local_240._28_4_ + 7.0;
                      local_160 = local_220;
                      local_140 = local_200;
                      uVar61 = CONCAT71(0,(byte)uVar133 & bVar67);
                      local_4c0._0_8_ = uVar61;
                      lVar64 = 0;
                      for (; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
                        lVar64 = lVar64 + 1;
                      }
                      local_470 = context;
                      local_260 = auVar9;
                      local_478 = pGVar12;
                      do {
                        auVar184 = auVar185._0_16_;
                        local_4a4 = local_180[lVar64];
                        local_4a0 = *(undefined4 *)(local_160 + lVar64 * 4);
                        local_440._0_8_ = lVar64;
                        local_520->tfar = *(float *)(local_140 + lVar64 * 4);
                        local_4f0.context = local_470->user;
                        fVar158 = 1.0 - local_4a4;
                        auVar20 = vfnmadd231ss_fma(ZEXT416((uint)(local_4a4 * (fVar158 + fVar158))),
                                                   ZEXT416((uint)fVar158),ZEXT416((uint)fVar158));
                        auVar73 = ZEXT416((uint)local_4a4);
                        auVar72 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar73,
                                                  ZEXT416(0xc0a00000));
                        auVar70 = vfmadd231ss_fma(ZEXT416((uint)(local_4a4 * local_4a4 * 3.0)),
                                                  ZEXT416((uint)(local_4a4 + local_4a4)),auVar72);
                        auVar72 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar73,
                                                  ZEXT416(0x40000000));
                        auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar158 * fVar158 * -3.0)),
                                                  ZEXT416((uint)(fVar158 + fVar158)),auVar72);
                        auVar73 = vfmadd231ss_fma(ZEXT416((uint)(local_4a4 * local_4a4)),auVar73,
                                                  ZEXT416((uint)(fVar158 * -2.0)));
                        fVar158 = auVar20._0_4_ * 0.5;
                        fVar132 = auVar70._0_4_ * 0.5;
                        fVar139 = auVar72._0_4_ * 0.5;
                        fVar140 = auVar73._0_4_ * 0.5;
                        auVar146._0_4_ = fVar140 * local_430;
                        auVar146._4_4_ = fVar140 * fStack_42c;
                        auVar146._8_4_ = fVar140 * fStack_428;
                        auVar146._12_4_ = fVar140 * fStack_424;
                        auVar157._4_4_ = fVar139;
                        auVar157._0_4_ = fVar139;
                        auVar157._8_4_ = fVar139;
                        auVar157._12_4_ = fVar139;
                        auVar57._8_8_ = uStack_4f8;
                        auVar57._0_8_ = local_500;
                        auVar72 = vfmadd132ps_fma(auVar157,auVar146,auVar57);
                        auVar147._4_4_ = fVar132;
                        auVar147._0_4_ = fVar132;
                        auVar147._8_4_ = fVar132;
                        auVar147._12_4_ = fVar132;
                        auVar72 = vfmadd213ps_fma(auVar147,local_460,auVar72);
                        auVar138._4_4_ = fVar158;
                        auVar138._0_4_ = fVar158;
                        auVar138._8_4_ = fVar158;
                        auVar138._12_4_ = fVar158;
                        auVar72 = vfmadd213ps_fma(auVar138,local_450,auVar72);
                        local_4b0 = vmovlps_avx(auVar72);
                        local_4a8 = vextractps_avx(auVar72,2);
                        local_49c = (int)local_468;
                        local_498 = (int)local_510;
                        local_494 = (local_4f0.context)->instID[0];
                        local_490 = (local_4f0.context)->instPrimID[0];
                        local_524 = -1;
                        local_4f0.valid = &local_524;
                        local_4f0.geometryUserPtr = local_478->userPtr;
                        local_4f0.ray = (RTCRayN *)local_520;
                        local_4f0.hit = (RTCHitN *)&local_4b0;
                        local_4f0.N = 1;
                        if ((local_478->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                           ((*local_478->occlusionFilterN)(&local_4f0), *local_4f0.valid != 0)) {
                          p_Var13 = local_470->args->filter;
                          if ((p_Var13 == (RTCFilterFunctionN)0x0) ||
                             ((((local_470->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                == RTC_RAY_QUERY_FLAG_INCOHERENT &&
                               (((local_478->field_8).field_0x2 & 0x40) == 0)) ||
                              ((*p_Var13)(&local_4f0), *local_4f0.valid != 0)))) {
                            bVar59 = 1;
                            auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar183 = ZEXT3264(auVar90);
                            auVar72 = vxorps_avx512vl(auVar184,auVar184);
                            auVar185 = ZEXT1664(auVar72);
                            auVar179 = ZEXT3264(local_3c0);
                            auVar186 = ZEXT3264(local_340);
                            auVar188 = ZEXT3264(local_3e0);
                            auVar189 = ZEXT3264(local_360);
                            auVar187 = ZEXT3264(local_400);
                            auVar191 = ZEXT3264(local_380);
                            auVar190 = ZEXT3264(local_3a0);
                            auVar192 = ZEXT3264(local_420);
                            context = local_470;
                            break;
                          }
                        }
                        local_520->tfar = (float)local_260._0_4_;
                        uVar63 = local_4c0._0_8_ ^ 1L << (local_440._0_8_ & 0x3f);
                        bVar59 = 0;
                        local_4c0._0_8_ = uVar63;
                        lVar64 = 0;
                        for (uVar61 = uVar63; (uVar61 & 1) == 0;
                            uVar61 = uVar61 >> 1 | 0x8000000000000000) {
                          lVar64 = lVar64 + 1;
                        }
                        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar183 = ZEXT3264(auVar90);
                        auVar72 = vxorps_avx512vl(auVar184,auVar184);
                        auVar185 = ZEXT1664(auVar72);
                        auVar179 = ZEXT3264(local_3c0);
                        auVar186 = ZEXT3264(local_340);
                        auVar188 = ZEXT3264(local_3e0);
                        auVar189 = ZEXT3264(local_360);
                        auVar187 = ZEXT3264(local_400);
                        auVar191 = ZEXT3264(local_380);
                        auVar190 = ZEXT3264(local_3a0);
                        auVar192 = ZEXT3264(local_420);
                        context = local_470;
                      } while (uVar63 != 0);
                    }
                    bVar65 = (bool)(bVar65 | bVar59);
                  }
                }
                goto LAB_01ad0387;
              }
            }
            auVar179 = ZEXT3264(auVar92);
          }
LAB_01ad0387:
          lVar62 = lVar62 + 8;
        } while ((int)lVar62 < iVar11);
      }
      if (bVar65) {
        return bVar65;
      }
      fVar158 = local_520->tfar;
      auVar26._4_4_ = fVar158;
      auVar26._0_4_ = fVar158;
      auVar26._8_4_ = fVar158;
      auVar26._12_4_ = fVar158;
      uVar133 = vcmpps_avx512vl(local_250,auVar26,2);
      uVar60 = (uint)uVar66 & (uint)uVar133;
      uVar66 = (ulong)uVar60;
    } while (uVar60 != 0);
  }
  return bVar65;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }